

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  Primitive PVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  unkbyte9 Var83;
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [13];
  undefined1 auVar89 [12];
  undefined1 auVar90 [13];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined6 uVar93;
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [13];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  vfloat_impl<4> vVar107;
  undefined4 uVar108;
  ulong uVar111;
  StackEntry *pSVar112;
  long extraout_RAX;
  uint uVar109;
  undefined4 uVar110;
  RTCRayN *pRVar113;
  long extraout_RAX_00;
  long lVar114;
  RTCIntersectArguments *pRVar115;
  RTCIntersectArguments *pRVar116;
  ulong uVar117;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  uint uVar118;
  ulong uVar119;
  ulong uVar120;
  byte bVar121;
  bool bVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  short sVar131;
  int iVar132;
  undefined1 auVar133 [12];
  int iVar184;
  __m128 a_1;
  char cVar187;
  undefined1 auVar138 [16];
  undefined1 auVar135 [12];
  undefined1 auVar142 [16];
  undefined1 auVar136 [12];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar182;
  float pp;
  float fVar188;
  float fVar212;
  float fVar213;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  char cVar214;
  float fVar215;
  float fVar217;
  char cVar242;
  float fVar243;
  float fVar245;
  vfloat4 a;
  float fVar216;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar244;
  float fVar246;
  float fVar247;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar248;
  float fVar249;
  char cVar262;
  undefined1 uVar263;
  undefined1 uVar264;
  float fVar265;
  float fVar267;
  undefined1 auVar250 [16];
  float fVar266;
  float fVar268;
  float fVar269;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar273 [12];
  float fVar298;
  float fVar300;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar274 [12];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  float fVar299;
  float fVar301;
  float fVar302;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  char cVar326;
  float fVar303;
  float fVar304;
  undefined1 auVar305 [12];
  float fVar327;
  float fVar329;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar306 [12];
  undefined1 auVar313 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar328;
  float fVar330;
  float fVar331;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar339;
  float fVar341;
  float fVar343;
  undefined1 auVar335 [16];
  float fVar340;
  float fVar342;
  float fVar344;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar345;
  float fVar346;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar374;
  float fVar376;
  undefined1 auVar361 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar375;
  float fVar377;
  float fVar378;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar371;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  float fVar379;
  float fVar380;
  undefined1 auVar381 [12];
  float fVar392;
  undefined1 auVar382 [16];
  undefined1 auVar386 [16];
  float fVar395;
  float fVar399;
  undefined1 auVar389 [16];
  float fVar393;
  float fVar394;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar400;
  float fVar401;
  float fVar402;
  undefined1 auVar390 [16];
  float fVar403;
  float fVar404;
  float fVar408;
  float fVar411;
  undefined1 auVar405 [16];
  float fVar409;
  float fVar410;
  float fVar412;
  float fVar413;
  float fVar414;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  float fVar415;
  ulong uVar416;
  float fVar421;
  float fVar423;
  undefined1 auVar417 [16];
  float fVar422;
  float fVar424;
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  float fVar425;
  float fVar426;
  float fVar434;
  float fVar437;
  __m128 a_2;
  undefined1 auVar427 [16];
  undefined1 auVar430 [16];
  float fVar435;
  float fVar436;
  float fVar438;
  float fVar439;
  float fVar440;
  undefined1 auVar431 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar432;
  undefined1 auVar433 [16];
  float fVar441;
  float fVar442;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  undefined1 auVar443 [16];
  float fVar449;
  float fVar455;
  float fVar456;
  float fVar457;
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 local_698 [8];
  float fStack_690;
  float fStack_68c;
  Vec3fa dir;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  short local_5f8;
  undefined2 uStack_5f6;
  undefined2 uStack_5f4;
  undefined2 uStack_5f2;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [16];
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined4 local_548;
  undefined4 uStack_544;
  float fStack_540;
  float fStack_53c;
  RTCFilterFunctionNArguments args;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_2b8;
  float fStack_2b4;
  float local_288;
  float fStack_284;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar134 [12];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined2 uVar183;
  int iVar185;
  int iVar186;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  undefined1 auVar293 [16];
  undefined1 auVar295 [16];
  undefined1 auVar278 [16];
  undefined1 auVar282 [16];
  undefined1 auVar279 [16];
  undefined1 auVar283 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  undefined1 auVar321 [16];
  undefined1 auVar323 [16];
  undefined1 auVar311 [16];
  undefined1 auVar315 [16];
  undefined1 auVar312 [16];
  undefined1 auVar316 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar387 [16];
  undefined1 auVar385 [16];
  undefined1 auVar388 [16];
  int iVar391;
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  
  PVar18 = prim[1];
  uVar111 = (ulong)(byte)PVar18;
  lVar114 = uVar111 * 0x25;
  uVar110 = *(undefined4 *)(prim + uVar111 * 4 + 6);
  uVar108 = *(undefined4 *)(prim + uVar111 * 5 + 6);
  uVar19 = *(undefined4 *)(prim + uVar111 * 6 + 6);
  uVar20 = *(undefined4 *)(prim + uVar111 * 0xf + 6);
  uVar21 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar22 = *(undefined4 *)(prim + uVar111 * 0x11 + 6);
  uVar23 = *(undefined4 *)(prim + uVar111 * 0x1a + 6);
  uVar24 = *(undefined4 *)(prim + uVar111 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar111 * 0x1c + 6);
  auVar308 = *(undefined1 (*) [16])(prim + lVar114 + 6);
  auVar232._12_4_ = auVar308._12_4_;
  auVar133._0_8_ = CONCAT44(auVar232._12_4_,auVar232._12_4_);
  auVar133._8_4_ = auVar232._12_4_;
  auVar232._0_12_ = auVar133;
  fVar270 = (*(float *)(ray + k * 4) - auVar308._0_4_) * auVar232._12_4_;
  fVar298 = (*(float *)(ray + k * 4 + 0x10) - auVar308._4_4_) * auVar232._12_4_;
  fVar300 = (*(float *)(ray + k * 4 + 0x20) - auVar308._8_4_) * auVar232._12_4_;
  fVar441 = *(float *)(ray + k * 4 + 0x40) * auVar232._12_4_;
  fVar444 = *(float *)(ray + k * 4 + 0x50) * auVar232._12_4_;
  fVar446 = *(float *)(ray + k * 4 + 0x60) * auVar232._12_4_;
  auVar34[0xd] = 0;
  auVar34._0_13_ = auVar232._0_13_;
  auVar34[0xe] = auVar308[0xf];
  auVar39[0xc] = auVar308[0xe];
  auVar39._0_12_ = auVar133;
  auVar39._13_2_ = auVar34._13_2_;
  auVar44[0xb] = 0;
  auVar44._0_11_ = auVar133._0_11_;
  auVar44._12_3_ = auVar39._12_3_;
  auVar49[10] = auVar308[0xd];
  auVar49._0_10_ = auVar133._0_10_;
  auVar49._11_4_ = auVar44._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar133._0_9_;
  auVar54._10_5_ = auVar49._10_5_;
  auVar59[8] = auVar308[0xc];
  auVar59._0_8_ = auVar133._0_8_;
  auVar59._9_6_ = auVar54._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar108 >> 0x18)),auVar308[0xf]);
  auVar64._6_9_ = Var83;
  auVar64[5] = (char)((uint)uVar108 >> 0x10);
  auVar64[4] = auVar308[0xe];
  auVar64._0_4_ = auVar232._12_4_;
  cVar242 = (char)((uint)uVar108 >> 8);
  auVar84._2_11_ = auVar64._4_11_;
  auVar84[1] = cVar242;
  auVar84[0] = auVar308[0xd];
  cVar214 = (char)uVar108;
  sVar131 = CONCAT11(cVar214,auVar308[0xc]);
  auVar69._2_13_ = auVar84;
  auVar69._0_2_ = sVar131;
  uVar183 = (undefined2)Var83;
  auVar366._0_12_ = auVar69._0_12_;
  auVar366._12_2_ = uVar183;
  auVar366._14_2_ = uVar183;
  auVar419._12_4_ = auVar366._12_4_;
  auVar419._0_10_ = auVar69._0_10_;
  auVar419._10_2_ = auVar64._4_2_;
  auVar308._10_6_ = auVar419._10_6_;
  auVar308._0_8_ = auVar69._0_8_;
  auVar308._8_2_ = auVar64._4_2_;
  auVar85._4_8_ = auVar308._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  iVar132 = (int)sVar131 >> 8;
  iVar184 = auVar85._0_4_ >> 0x18;
  auVar134._0_8_ = CONCAT44(iVar184,iVar132);
  auVar134._8_4_ = auVar308._8_4_ >> 0x18;
  auVar137._12_4_ = auVar419._12_4_ >> 0x18;
  auVar137._0_12_ = auVar134;
  fVar408 = (float)iVar184;
  cVar187 = cVar242 >> 7;
  auVar35[0xd] = 0;
  auVar35._0_13_ = auVar137._0_13_;
  auVar35[0xe] = cVar187;
  auVar40[0xc] = cVar187;
  auVar40._0_12_ = auVar134;
  auVar40._13_2_ = auVar35._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar134._0_11_;
  auVar45._12_3_ = auVar40._12_3_;
  auVar50[10] = cVar187;
  auVar50._0_10_ = auVar134._0_10_;
  auVar50._11_4_ = auVar45._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar134._0_9_;
  auVar55._10_5_ = auVar50._10_5_;
  auVar60[8] = cVar242;
  auVar60._0_8_ = auVar134._0_8_;
  auVar60._9_6_ = auVar55._9_6_;
  uVar264 = (undefined1)((uint)uVar19 >> 0x18);
  Var83 = CONCAT81(CONCAT71(auVar60._8_7_,uVar264),(short)cVar214 >> 7);
  uVar263 = (undefined1)((uint)uVar19 >> 0x10);
  auVar65._6_9_ = Var83;
  auVar65[5] = uVar263;
  auVar65[4] = (undefined1)((short)cVar214 >> 7);
  auVar65._0_4_ = iVar132;
  cVar262 = (char)((uint)uVar19 >> 8);
  auVar86._2_11_ = auVar65._4_11_;
  auVar86[1] = cVar262;
  auVar86[0] = (undefined1)((short)cVar214 >> 7);
  cVar242 = (char)uVar19;
  auVar70._2_13_ = auVar86;
  auVar70._0_2_ = CONCAT11(cVar242,cVar214);
  uVar183 = (undefined2)Var83;
  auVar140._0_12_ = auVar70._0_12_;
  auVar140._12_2_ = uVar183;
  auVar140._14_2_ = uVar183;
  auVar139._12_4_ = auVar140._12_4_;
  auVar139._0_10_ = auVar70._0_10_;
  auVar139._10_2_ = auVar65._4_2_;
  auVar138._10_6_ = auVar139._10_6_;
  auVar138._0_8_ = auVar70._0_8_;
  auVar138._8_2_ = auVar65._4_2_;
  auVar87._4_8_ = auVar138._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  iVar184 = (int)CONCAT11(cVar242,cVar214) >> 8;
  iVar185 = auVar87._0_4_ >> 0x18;
  auVar135._0_8_ = CONCAT44(iVar185,iVar184);
  auVar135._8_4_ = auVar138._8_4_ >> 0x18;
  auVar141._12_4_ = auVar139._12_4_ >> 0x18;
  auVar141._0_12_ = auVar135;
  fVar421 = (float)iVar185;
  cVar187 = cVar262 >> 7;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar141._0_13_;
  auVar36[0xe] = cVar187;
  auVar41[0xc] = cVar187;
  auVar41._0_12_ = auVar135;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar135._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = cVar187;
  auVar51._0_10_ = auVar135._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar135._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = cVar262;
  auVar61._0_8_ = auVar135._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar242 >> 7);
  auVar66._6_9_ = Var83;
  auVar66[5] = (char)((uint)uVar21 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar242 >> 7);
  auVar66._0_4_ = iVar184;
  cVar326 = (char)((uint)uVar21 >> 8);
  auVar88._2_11_ = auVar66._4_11_;
  auVar88[1] = cVar326;
  auVar88[0] = (undefined1)((short)cVar242 >> 7);
  cVar214 = (char)uVar21;
  auVar71._2_13_ = auVar88;
  auVar71._0_2_ = CONCAT11(cVar214,cVar242);
  uVar183 = (undefined2)Var83;
  auVar144._0_12_ = auVar71._0_12_;
  auVar144._12_2_ = uVar183;
  auVar144._14_2_ = uVar183;
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._0_10_ = auVar71._0_10_;
  auVar143._10_2_ = auVar66._4_2_;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = auVar71._0_8_;
  auVar142._8_2_ = auVar66._4_2_;
  auVar89._4_8_ = auVar142._8_8_;
  auVar89._2_2_ = auVar88._0_2_;
  auVar89._0_2_ = auVar88._0_2_;
  iVar185 = (int)CONCAT11(cVar214,cVar242) >> 8;
  iVar186 = auVar89._0_4_ >> 0x18;
  auVar136._0_8_ = CONCAT44(iVar186,iVar185);
  auVar136._8_4_ = auVar142._8_4_ >> 0x18;
  auVar145._12_4_ = auVar143._12_4_ >> 0x18;
  auVar145._0_12_ = auVar136;
  fVar351 = (float)iVar186;
  cVar187 = cVar326 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar145._0_13_;
  auVar37[0xe] = cVar187;
  auVar42[0xc] = cVar187;
  auVar42._0_12_ = auVar136;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar136._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar187;
  auVar52._0_10_ = auVar136._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar136._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar326;
  auVar62._0_8_ = auVar136._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar214 >> 7);
  auVar67._6_9_ = Var83;
  auVar67[5] = (char)((uint)uVar22 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar214 >> 7);
  auVar67._0_4_ = iVar185;
  auVar90._2_11_ = auVar67._4_11_;
  auVar90[1] = (char)((uint)uVar22 >> 8);
  auVar90[0] = (undefined1)((short)cVar214 >> 7);
  sVar131 = CONCAT11((char)uVar22,cVar214);
  auVar72._2_13_ = auVar90;
  auVar72._0_2_ = sVar131;
  uVar183 = (undefined2)Var83;
  auVar148._0_12_ = auVar72._0_12_;
  auVar148._12_2_ = uVar183;
  auVar148._14_2_ = uVar183;
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._0_10_ = auVar72._0_10_;
  auVar147._10_2_ = auVar67._4_2_;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._0_8_ = auVar72._0_8_;
  auVar146._8_2_ = auVar67._4_2_;
  auVar91._4_8_ = auVar146._8_8_;
  auVar91._2_2_ = auVar90._0_2_;
  auVar91._0_2_ = auVar90._0_2_;
  fVar188 = (float)((int)sVar131 >> 8);
  fVar212 = (float)(auVar91._0_4_ >> 0x18);
  fVar213 = (float)(auVar146._8_4_ >> 0x18);
  fVar215 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar114 + 0x16)) *
            *(float *)(prim + lVar114 + 0x1a);
  dir.field_0._0_1_ = (undefined1)uVar110;
  dir.field_0._1_1_ = (undefined1)((uint)uVar110 >> 8);
  dir.field_0._2_1_ = (undefined1)((uint)uVar110 >> 0x10);
  dir.field_0._3_1_ = (undefined1)((uint)uVar110 >> 0x18);
  uVar183 = CONCAT11(dir.field_0._3_1_,uVar264);
  uVar10 = CONCAT35(CONCAT21(uVar183,dir.field_0._2_1_),CONCAT14(uVar263,uVar19));
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),dir.field_0._1_1_),cVar262);
  uVar119 = CONCAT62(uVar93,CONCAT11(dir.field_0._0_1_,cVar242));
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar119;
  auVar252._12_2_ = uVar183;
  auVar252._14_2_ = uVar183;
  uVar183 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar119;
  auVar251._10_2_ = uVar183;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar183;
  auVar250._0_8_ = uVar119;
  uVar183 = (undefined2)uVar93;
  auVar92._4_8_ = auVar250._8_8_;
  auVar92._2_2_ = uVar183;
  auVar92._0_2_ = uVar183;
  fVar332 = (float)((int)CONCAT11(dir.field_0._0_1_,cVar242) >> 8);
  fVar339 = (float)(auVar92._0_4_ >> 0x18);
  fVar341 = (float)(auVar250._8_4_ >> 0x18);
  uVar263 = (undefined1)((uint)uVar20 >> 0x18);
  uVar183 = CONCAT11(uVar263,uVar263);
  uVar263 = (undefined1)((uint)uVar20 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar183,uVar263),CONCAT14(uVar263,uVar20));
  uVar263 = (undefined1)((uint)uVar20 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar263),uVar263);
  sVar131 = CONCAT11((char)uVar20,(char)uVar20);
  uVar119 = CONCAT62(uVar93,sVar131);
  auVar429._8_4_ = 0;
  auVar429._0_8_ = uVar119;
  auVar429._12_2_ = uVar183;
  auVar429._14_2_ = uVar183;
  uVar183 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar428._12_4_ = auVar429._12_4_;
  auVar428._8_2_ = 0;
  auVar428._0_8_ = uVar119;
  auVar428._10_2_ = uVar183;
  auVar427._10_6_ = auVar428._10_6_;
  auVar427._8_2_ = uVar183;
  auVar427._0_8_ = uVar119;
  uVar183 = (undefined2)uVar93;
  auVar94._4_8_ = auVar427._8_8_;
  auVar94._2_2_ = uVar183;
  auVar94._0_2_ = uVar183;
  fVar248 = (float)((int)sVar131 >> 8);
  fVar265 = (float)(auVar94._0_4_ >> 0x18);
  fVar267 = (float)(auVar427._8_4_ >> 0x18);
  uVar263 = (undefined1)((uint)uVar23 >> 0x18);
  uVar183 = CONCAT11(uVar263,uVar263);
  uVar263 = (undefined1)((uint)uVar23 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar183,uVar263),CONCAT14(uVar263,uVar23));
  uVar263 = (undefined1)((uint)uVar23 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar263),uVar263);
  sVar131 = CONCAT11((char)uVar23,(char)uVar23);
  uVar119 = CONCAT62(uVar93,sVar131);
  auVar363._8_4_ = 0;
  auVar363._0_8_ = uVar119;
  auVar363._12_2_ = uVar183;
  auVar363._14_2_ = uVar183;
  uVar183 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar362._12_4_ = auVar363._12_4_;
  auVar362._8_2_ = 0;
  auVar362._0_8_ = uVar119;
  auVar362._10_2_ = uVar183;
  auVar361._10_6_ = auVar362._10_6_;
  auVar361._8_2_ = uVar183;
  auVar361._0_8_ = uVar119;
  uVar183 = (undefined2)uVar93;
  auVar95._4_8_ = auVar361._8_8_;
  auVar95._2_2_ = uVar183;
  auVar95._0_2_ = uVar183;
  fVar358 = (float)((int)sVar131 >> 8);
  fVar374 = (float)(auVar95._0_4_ >> 0x18);
  fVar376 = (float)(auVar361._8_4_ >> 0x18);
  uVar263 = (undefined1)((uint)uVar24 >> 0x18);
  uVar183 = CONCAT11(uVar263,uVar263);
  uVar263 = (undefined1)((uint)uVar24 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar183,uVar263),CONCAT14(uVar263,uVar24));
  cVar214 = (char)((uint)uVar24 >> 8);
  uVar93 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),cVar214),cVar214);
  cVar187 = (char)uVar24;
  uVar119 = CONCAT62(uVar93,CONCAT11(cVar187,cVar187));
  auVar384._8_4_ = 0;
  auVar384._0_8_ = uVar119;
  auVar384._12_2_ = uVar183;
  auVar384._14_2_ = uVar183;
  uVar183 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar383._12_4_ = auVar384._12_4_;
  auVar383._8_2_ = 0;
  auVar383._0_8_ = uVar119;
  auVar383._10_2_ = uVar183;
  auVar382._10_6_ = auVar383._10_6_;
  auVar382._8_2_ = uVar183;
  auVar382._0_8_ = uVar119;
  uVar183 = (undefined2)uVar93;
  auVar96._4_8_ = auVar382._8_8_;
  auVar96._2_2_ = uVar183;
  auVar96._0_2_ = uVar183;
  iVar186 = (int)CONCAT11(cVar187,cVar187) >> 8;
  iVar391 = auVar96._0_4_ >> 0x18;
  auVar381._0_8_ = CONCAT44(iVar391,iVar186);
  auVar381._8_4_ = auVar382._8_4_ >> 0x18;
  auVar385._12_4_ = auVar383._12_4_ >> 0x18;
  auVar385._0_12_ = auVar381;
  fVar434 = (float)iVar391;
  cVar242 = cVar214 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar385._0_13_;
  auVar38[0xe] = cVar242;
  auVar43[0xc] = cVar242;
  auVar43._0_12_ = auVar381;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar381._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar242;
  auVar53._0_10_ = auVar381._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar381._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar214;
  auVar63._0_8_ = auVar381._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var83 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar187 >> 7);
  auVar68._6_9_ = Var83;
  auVar68[5] = (char)((uint)uVar25 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar187 >> 7);
  auVar68._0_4_ = iVar186;
  auVar97._2_11_ = auVar68._4_11_;
  auVar97[1] = (char)((uint)uVar25 >> 8);
  auVar97[0] = (undefined1)((short)cVar187 >> 7);
  sVar131 = CONCAT11((char)uVar25,cVar187);
  auVar73._2_13_ = auVar97;
  auVar73._0_2_ = sVar131;
  uVar183 = (undefined2)Var83;
  auVar388._0_12_ = auVar73._0_12_;
  auVar388._12_2_ = uVar183;
  auVar388._14_2_ = uVar183;
  auVar387._12_4_ = auVar388._12_4_;
  auVar387._0_10_ = auVar73._0_10_;
  auVar387._10_2_ = auVar68._4_2_;
  auVar386._10_6_ = auVar387._10_6_;
  auVar386._0_8_ = auVar73._0_8_;
  auVar386._8_2_ = auVar68._4_2_;
  auVar98._4_8_ = auVar386._8_8_;
  auVar98._2_2_ = auVar97._0_2_;
  auVar98._0_2_ = auVar97._0_2_;
  fVar216 = (float)((int)sVar131 >> 8);
  fVar243 = (float)(auVar98._0_4_ >> 0x18);
  fVar245 = (float)(auVar386._8_4_ >> 0x18);
  fVar449 = fVar441 * fVar332 + fVar444 * (float)iVar132 + fVar446 * (float)iVar184;
  fVar455 = fVar441 * fVar339 + fVar444 * fVar408 + fVar446 * fVar421;
  fVar456 = fVar441 * fVar341 + fVar444 * (float)auVar134._8_4_ + fVar446 * (float)auVar135._8_4_;
  fVar457 = fVar441 * (float)(auVar251._12_4_ >> 0x18) +
            fVar444 * (float)auVar137._12_4_ + fVar446 * (float)auVar141._12_4_;
  fVar379 = fVar441 * fVar248 + fVar444 * (float)iVar185 + fVar446 * fVar188;
  fVar392 = fVar441 * fVar265 + fVar444 * fVar351 + fVar446 * fVar212;
  fVar395 = fVar441 * fVar267 + fVar444 * (float)auVar136._8_4_ + fVar446 * fVar213;
  fVar399 = fVar441 * (float)(auVar428._12_4_ >> 0x18) +
            fVar444 * (float)auVar145._12_4_ + fVar446 * (float)(auVar147._12_4_ >> 0x18);
  fVar303 = fVar441 * fVar358 + fVar444 * (float)iVar186 + fVar446 * fVar216;
  fVar327 = fVar441 * fVar374 + fVar444 * fVar434 + fVar446 * fVar243;
  fVar329 = fVar441 * fVar376 + fVar444 * (float)auVar381._8_4_ + fVar446 * fVar245;
  fVar446 = fVar441 * (float)(auVar362._12_4_ >> 0x18) +
            fVar444 * (float)auVar385._12_4_ + fVar446 * (float)(auVar387._12_4_ >> 0x18);
  uVar10 = *(undefined8 *)(prim + uVar111 * 7 + 6);
  uVar11 = *(undefined8 *)(prim + uVar111 * 0xb + 6);
  local_5f8 = (short)uVar11;
  uStack_5f6 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_5f4 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_5f2 = (undefined2)((ulong)uVar11 >> 0x30);
  uVar11 = *(undefined8 *)(prim + uVar111 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar111 * 0xd + 6);
  local_548._0_2_ = (short)uVar12;
  local_548._2_2_ = (undefined2)((ulong)uVar12 >> 0x10);
  fVar441 = (float)uVar12;
  uStack_544._0_2_ = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_544._2_2_ = (undefined2)((ulong)uVar12 >> 0x30);
  fVar444 = (float)((ulong)uVar12 >> 0x20);
  fStack_540 = 0.0;
  fStack_53c = 0.0;
  fVar333 = fVar332 * fVar270 + (float)iVar132 * fVar298 + (float)iVar184 * fVar300;
  fVar408 = fVar339 * fVar270 + fVar408 * fVar298 + fVar421 * fVar300;
  fVar421 = fVar341 * fVar270 + (float)auVar134._8_4_ * fVar298 + (float)auVar135._8_4_ * fVar300;
  fVar343 = (float)(auVar251._12_4_ >> 0x18) * fVar270 +
            (float)auVar137._12_4_ * fVar298 + (float)auVar141._12_4_ * fVar300;
  fVar442 = fVar248 * fVar270 + (float)iVar185 * fVar298 + fVar188 * fVar300;
  fVar445 = fVar265 * fVar270 + fVar351 * fVar298 + fVar212 * fVar300;
  fVar447 = fVar267 * fVar270 + (float)auVar136._8_4_ * fVar298 + fVar213 * fVar300;
  fVar448 = (float)(auVar428._12_4_ >> 0x18) * fVar270 +
            (float)auVar145._12_4_ * fVar298 + (float)(auVar147._12_4_ >> 0x18) * fVar300;
  fVar332 = fVar270 * fVar358 + fVar298 * (float)iVar186 + fVar300 * fVar216;
  fVar339 = fVar270 * fVar374 + fVar298 * fVar434 + fVar300 * fVar243;
  fVar341 = fVar270 * fVar376 + fVar298 * (float)auVar381._8_4_ + fVar300 * fVar245;
  fVar351 = fVar270 * (float)(auVar362._12_4_ >> 0x18) +
            fVar298 * (float)auVar385._12_4_ + fVar300 * (float)(auVar387._12_4_ >> 0x18);
  uVar123 = -(uint)(1e-18 <= ABS(fVar449));
  uVar125 = -(uint)(1e-18 <= ABS(fVar455));
  uVar127 = -(uint)(1e-18 <= ABS(fVar456));
  uVar129 = -(uint)(1e-18 <= ABS(fVar457));
  auVar450._0_4_ = (uint)fVar449 & uVar123;
  auVar450._4_4_ = (uint)fVar455 & uVar125;
  auVar450._8_4_ = (uint)fVar456 & uVar127;
  auVar450._12_4_ = (uint)fVar457 & uVar129;
  auVar149._0_8_ = CONCAT44(~uVar125,~uVar123) & 0x219392ef219392ef;
  auVar149._8_4_ = ~uVar127 & 0x219392ef;
  auVar149._12_4_ = ~uVar129 & 0x219392ef;
  auVar149 = auVar149 | auVar450;
  uVar123 = -(uint)(1e-18 <= ABS(fVar379));
  uVar125 = -(uint)(1e-18 <= ABS(fVar392));
  uVar127 = -(uint)(1e-18 <= ABS(fVar395));
  uVar129 = -(uint)(1e-18 <= ABS(fVar399));
  auVar389._0_4_ = (uint)fVar379 & uVar123;
  auVar389._4_4_ = (uint)fVar392 & uVar125;
  auVar389._8_4_ = (uint)fVar395 & uVar127;
  auVar389._12_4_ = (uint)fVar399 & uVar129;
  auVar218._0_8_ = CONCAT44(~uVar125,~uVar123) & 0x219392ef219392ef;
  auVar218._8_4_ = ~uVar127 & 0x219392ef;
  auVar218._12_4_ = ~uVar129 & 0x219392ef;
  auVar218 = auVar218 | auVar389;
  uVar123 = -(uint)(1e-18 <= ABS(fVar303));
  uVar125 = -(uint)(1e-18 <= ABS(fVar327));
  uVar127 = -(uint)(1e-18 <= ABS(fVar329));
  uVar129 = -(uint)(1e-18 <= ABS(fVar446));
  auVar307._0_4_ = (uint)fVar303 & uVar123;
  auVar307._4_4_ = (uint)fVar327 & uVar125;
  auVar307._8_4_ = (uint)fVar329 & uVar127;
  auVar307._12_4_ = (uint)fVar446 & uVar129;
  auVar275._0_8_ = CONCAT44(~uVar125,~uVar123) & 0x219392ef219392ef;
  auVar275._8_4_ = ~uVar127 & 0x219392ef;
  auVar275._12_4_ = ~uVar129 & 0x219392ef;
  auVar275 = auVar275 | auVar307;
  auVar308 = rcpps(auVar307,auVar149);
  fVar358 = auVar308._0_4_;
  auVar150._0_4_ = auVar149._0_4_ * fVar358;
  fVar374 = auVar308._4_4_;
  auVar150._4_4_ = auVar149._4_4_ * fVar374;
  fVar379 = auVar308._8_4_;
  auVar150._8_4_ = auVar149._8_4_ * fVar379;
  fVar392 = auVar308._12_4_;
  auVar150._12_4_ = auVar149._12_4_ * fVar392;
  fVar358 = (1.0 - auVar150._0_4_) * fVar358 + fVar358;
  fVar374 = (1.0 - auVar150._4_4_) * fVar374 + fVar374;
  fVar379 = (1.0 - auVar150._8_4_) * fVar379 + fVar379;
  fVar392 = (1.0 - auVar150._12_4_) * fVar392 + fVar392;
  auVar308 = rcpps(auVar150,auVar218);
  fVar188 = auVar308._0_4_;
  fVar213 = auVar308._4_4_;
  fVar265 = auVar308._8_4_;
  fVar303 = auVar308._12_4_;
  fVar188 = (1.0 - auVar218._0_4_ * fVar188) * fVar188 + fVar188;
  fVar213 = (1.0 - auVar218._4_4_ * fVar213) * fVar213 + fVar213;
  fVar265 = (1.0 - auVar218._8_4_ * fVar265) * fVar265 + fVar265;
  fVar303 = (1.0 - auVar218._12_4_ * fVar303) * fVar303 + fVar303;
  auVar308 = rcpps(auVar308,auVar275);
  fVar212 = auVar308._0_4_;
  auVar276._0_4_ = auVar275._0_4_ * fVar212;
  fVar216 = auVar308._4_4_;
  fVar243 = auVar275._4_4_ * fVar216;
  auVar273._0_8_ = CONCAT44(fVar243,auVar276._0_4_);
  fVar267 = auVar308._8_4_;
  auVar273._8_4_ = auVar275._8_4_ * fVar267;
  fVar327 = auVar308._12_4_;
  uVar119 = *(ulong *)(prim + uVar111 * 0x12 + 6);
  fVar212 = (1.0 - auVar276._0_4_) * fVar212 + fVar212;
  fVar216 = (1.0 - fVar243) * fVar216 + fVar216;
  fVar267 = (1.0 - auVar273._8_4_) * fVar267 + fVar267;
  fVar327 = (1.0 - auVar275._12_4_ * fVar327) * fVar327 + fVar327;
  uVar120 = *(ulong *)(prim + uVar111 * 0x16 + 6);
  dir.field_0._0_2_ = (undefined2)uVar10;
  dir.field_0._2_2_ = (undefined2)((ulong)uVar10 >> 0x10);
  dir.field_0._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  dir.field_0._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
  auVar279._12_2_ = (short)((uint)fVar243 >> 0x10);
  auVar279._0_12_ = auVar273;
  auVar279._14_2_ = dir.field_0._6_2_;
  auVar278._12_4_ = auVar279._12_4_;
  auVar278._0_10_ = auVar273._0_10_;
  auVar278._10_2_ = dir.field_0._4_2_;
  auVar277._10_6_ = auVar278._10_6_;
  auVar277._8_2_ = SUB42(fVar243,0);
  auVar277._0_8_ = auVar273._0_8_;
  auVar276._8_8_ = auVar277._8_8_;
  auVar276._6_2_ = dir.field_0._2_2_;
  auVar276._4_2_ = (short)((uint)auVar276._0_4_ >> 0x10);
  auVar280._0_4_ = (int)(short)dir.field_0._0_2_;
  iVar132 = auVar276._4_4_ >> 0x10;
  auVar274._0_8_ = CONCAT44(iVar132,auVar280._0_4_);
  auVar274._8_4_ = auVar277._8_4_ >> 0x10;
  auVar309._0_4_ = (float)auVar280._0_4_;
  fVar376 = (float)iVar132;
  auVar305._0_8_ = CONCAT44(fVar376,auVar309._0_4_);
  auVar305._8_4_ = (float)auVar274._8_4_;
  auVar283._12_2_ = (short)dir.field_0._2_2_ >> 0xf;
  auVar283._0_12_ = auVar274;
  auVar283._14_2_ = uStack_5f2;
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._0_10_ = auVar274._0_10_;
  auVar282._10_2_ = uStack_5f4;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._8_2_ = dir.field_0._2_2_;
  auVar281._0_8_ = auVar274._0_8_;
  auVar280._8_8_ = auVar281._8_8_;
  auVar280._6_2_ = uStack_5f6;
  auVar280._4_2_ = (short)dir.field_0._0_2_ >> 0xf;
  auVar312._12_2_ = (short)((uint)fVar376 >> 0x10);
  auVar312._0_12_ = auVar305;
  auVar312._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar311._12_4_ = auVar312._12_4_;
  auVar311._0_10_ = auVar305._0_10_;
  auVar311._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar310._10_6_ = auVar311._10_6_;
  auVar310._8_2_ = SUB42(fVar376,0);
  auVar310._0_8_ = auVar305._0_8_;
  auVar309._8_8_ = auVar310._8_8_;
  sVar131 = (short)((ulong)uVar11 >> 0x10);
  auVar309._6_2_ = sVar131;
  auVar309._4_2_ = (short)((uint)auVar309._0_4_ >> 0x10);
  auVar313._0_4_ = (int)(short)uVar11;
  iVar132 = auVar309._4_4_ >> 0x10;
  auVar306._0_8_ = CONCAT44(iVar132,auVar313._0_4_);
  auVar306._8_4_ = auVar310._8_4_ >> 0x10;
  fVar395 = (float)iVar132;
  auVar316._12_2_ = sVar131 >> 0xf;
  auVar316._0_12_ = auVar306;
  auVar316._14_2_ = uStack_544._2_2_;
  auVar315._12_4_ = auVar316._12_4_;
  auVar315._0_10_ = auVar306._0_10_;
  auVar315._10_2_ = (undefined2)uStack_544;
  auVar314._10_6_ = auVar315._10_6_;
  auVar314._8_2_ = sVar131;
  auVar314._0_8_ = auVar306._0_8_;
  auVar313._8_8_ = auVar314._8_8_;
  auVar313._6_2_ = local_548._2_2_;
  auVar313._4_2_ = (short)uVar11 >> 0xf;
  uVar183 = (undefined2)(uVar119 >> 0x30);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar119;
  auVar221._12_2_ = uVar183;
  auVar221._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar119 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar119;
  auVar220._10_2_ = uVar183;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar183;
  auVar219._0_8_ = uVar119;
  uVar183 = (undefined2)(uVar119 >> 0x10);
  auVar99._4_8_ = auVar219._8_8_;
  auVar99._2_2_ = uVar183;
  auVar99._0_2_ = uVar183;
  fVar329 = (float)(auVar99._0_4_ >> 0x10);
  fVar446 = (float)(auVar219._8_4_ >> 0x10);
  uVar183 = (undefined2)(uVar120 >> 0x30);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar120;
  auVar153._12_2_ = uVar183;
  auVar153._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar120 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar120;
  auVar152._10_2_ = uVar183;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = uVar183;
  auVar151._0_8_ = uVar120;
  uVar183 = (undefined2)(uVar120 >> 0x10);
  auVar100._4_8_ = auVar151._8_8_;
  auVar100._2_2_ = uVar183;
  auVar100._0_2_ = uVar183;
  uVar117 = *(ulong *)(prim + uVar111 * 0x14 + 6);
  uVar183 = (undefined2)(uVar117 >> 0x30);
  auVar156._8_4_ = 0;
  auVar156._0_8_ = uVar117;
  auVar156._12_2_ = uVar183;
  auVar156._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar117 >> 0x20);
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._8_2_ = 0;
  auVar155._0_8_ = uVar117;
  auVar155._10_2_ = uVar183;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._8_2_ = uVar183;
  auVar154._0_8_ = uVar117;
  uVar183 = (undefined2)(uVar117 >> 0x10);
  auVar101._4_8_ = auVar154._8_8_;
  auVar101._2_2_ = uVar183;
  auVar101._0_2_ = uVar183;
  fVar243 = (float)(auVar101._0_4_ >> 0x10);
  fVar270 = (float)(auVar154._8_4_ >> 0x10);
  uVar416 = *(ulong *)(prim + uVar111 * 0x18 + 6);
  uVar183 = (undefined2)(uVar416 >> 0x30);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar416;
  auVar224._12_2_ = uVar183;
  auVar224._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar416 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar416;
  auVar223._10_2_ = uVar183;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar183;
  auVar222._0_8_ = uVar416;
  uVar183 = (undefined2)(uVar416 >> 0x10);
  auVar102._4_8_ = auVar222._8_8_;
  auVar102._2_2_ = uVar183;
  auVar102._0_2_ = uVar183;
  uVar13 = *(ulong *)(prim + uVar111 * 0x1d + 6);
  uVar183 = (undefined2)(uVar13 >> 0x30);
  auVar159._8_4_ = 0;
  auVar159._0_8_ = uVar13;
  auVar159._12_2_ = uVar183;
  auVar159._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar13 >> 0x20);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar13;
  auVar158._10_2_ = uVar183;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._8_2_ = uVar183;
  auVar157._0_8_ = uVar13;
  uVar183 = (undefined2)(uVar13 >> 0x10);
  auVar103._4_8_ = auVar157._8_8_;
  auVar103._2_2_ = uVar183;
  auVar103._0_2_ = uVar183;
  fVar245 = (float)(auVar103._0_4_ >> 0x10);
  fVar298 = (float)(auVar157._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar111 * 0x21 + 6);
  uVar183 = (undefined2)(uVar14 >> 0x30);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar14;
  auVar227._12_2_ = uVar183;
  auVar227._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar14 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar14;
  auVar226._10_2_ = uVar183;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar183;
  auVar225._0_8_ = uVar14;
  uVar183 = (undefined2)(uVar14 >> 0x10);
  auVar104._4_8_ = auVar225._8_8_;
  auVar104._2_2_ = uVar183;
  auVar104._0_2_ = uVar183;
  uVar15 = *(ulong *)(prim + uVar111 * 0x1f + 6);
  uVar183 = (undefined2)(uVar15 >> 0x30);
  auVar162._8_4_ = 0;
  auVar162._0_8_ = uVar15;
  auVar162._12_2_ = uVar183;
  auVar162._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar15 >> 0x20);
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._8_2_ = 0;
  auVar161._0_8_ = uVar15;
  auVar161._10_2_ = uVar183;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._8_2_ = uVar183;
  auVar160._0_8_ = uVar15;
  uVar183 = (undefined2)(uVar15 >> 0x10);
  auVar105._4_8_ = auVar160._8_8_;
  auVar105._2_2_ = uVar183;
  auVar105._0_2_ = uVar183;
  fVar248 = (float)(auVar105._0_4_ >> 0x10);
  fVar300 = (float)(auVar160._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar111 * 0x23 + 6);
  uVar183 = (undefined2)(uVar16 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar16;
  auVar230._12_2_ = uVar183;
  auVar230._14_2_ = uVar183;
  uVar183 = (undefined2)(uVar16 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar16;
  auVar229._10_2_ = uVar183;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar183;
  auVar228._0_8_ = uVar16;
  uVar183 = (undefined2)(uVar16 >> 0x10);
  auVar106._4_8_ = auVar228._8_8_;
  auVar106._2_2_ = uVar183;
  auVar106._0_2_ = uVar183;
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar284._0_8_ =
       CONCAT44(((((float)(auVar280._4_4_ >> 0x10) - fVar376) * fVar215 + fVar376) - fVar408) *
                fVar374,((((float)(int)local_5f8 - auVar309._0_4_) * fVar215 + auVar309._0_4_) -
                        fVar333) * fVar358);
  auVar284._8_4_ =
       ((((float)(auVar281._8_4_ >> 0x10) - auVar305._8_4_) * fVar215 + auVar305._8_4_) - fVar421) *
       fVar379;
  auVar284._12_4_ =
       ((((float)(auVar282._12_4_ >> 0x10) - (float)(auVar278._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar278._12_4_ >> 0x10)) - fVar343) * fVar392;
  auVar317._0_4_ =
       ((((float)(int)(short)local_548 - (float)auVar313._0_4_) * fVar215 + (float)auVar313._0_4_) -
       fVar333) * fVar358;
  auVar317._4_4_ =
       ((((float)(auVar313._4_4_ >> 0x10) - fVar395) * fVar215 + fVar395) - fVar408) * fVar374;
  auVar317._8_4_ =
       ((((float)(auVar314._8_4_ >> 0x10) - (float)auVar306._8_4_) * fVar215 + (float)auVar306._8_4_
        ) - fVar421) * fVar379;
  auVar317._12_4_ =
       ((((float)(auVar315._12_4_ >> 0x10) - (float)(auVar311._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar311._12_4_ >> 0x10)) - fVar343) * fVar392;
  auVar335._0_8_ =
       CONCAT44(((((float)(auVar100._0_4_ >> 0x10) - fVar329) * fVar215 + fVar329) - fVar445) *
                fVar213,((((float)(int)(short)uVar120 - (float)(int)(short)uVar119) * fVar215 +
                         (float)(int)(short)uVar119) - fVar442) * fVar188);
  auVar335._8_4_ =
       ((((float)(auVar151._8_4_ >> 0x10) - fVar446) * fVar215 + fVar446) - fVar447) * fVar265;
  auVar335._12_4_ =
       ((((float)(auVar152._12_4_ >> 0x10) - (float)(auVar220._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar220._12_4_ >> 0x10)) - fVar448) * fVar303;
  auVar405._0_4_ =
       ((((float)(int)(short)uVar416 - (float)(int)(short)uVar117) * fVar215 +
        (float)(int)(short)uVar117) - fVar442) * fVar188;
  auVar405._4_4_ =
       ((((float)(auVar102._0_4_ >> 0x10) - fVar243) * fVar215 + fVar243) - fVar445) * fVar213;
  auVar405._8_4_ =
       ((((float)(auVar222._8_4_ >> 0x10) - fVar270) * fVar215 + fVar270) - fVar447) * fVar265;
  auVar405._12_4_ =
       ((((float)(auVar223._12_4_ >> 0x10) - (float)(auVar155._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar155._12_4_ >> 0x10)) - fVar448) * fVar303;
  auVar417._0_8_ =
       CONCAT44(((((float)(auVar104._0_4_ >> 0x10) - fVar245) * fVar215 + fVar245) - fVar339) *
                fVar216,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar215 +
                         (float)(int)(short)uVar13) - fVar332) * fVar212);
  auVar417._8_4_ =
       ((((float)(auVar225._8_4_ >> 0x10) - fVar298) * fVar215 + fVar298) - fVar341) * fVar267;
  auVar417._12_4_ =
       ((((float)(auVar226._12_4_ >> 0x10) - (float)(auVar158._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar158._12_4_ >> 0x10)) - fVar351) * fVar327;
  auVar430._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar215 +
        (float)(int)(short)uVar15) - fVar332) * fVar212;
  auVar430._4_4_ =
       ((((float)(auVar106._0_4_ >> 0x10) - fVar248) * fVar215 + fVar248) - fVar339) * fVar216;
  auVar430._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar300) * fVar215 + fVar300) - fVar341) * fVar267;
  auVar430._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar161._12_4_ >> 0x10)) * fVar215 +
        (float)(auVar161._12_4_ >> 0x10)) - fVar351) * fVar327;
  auVar231._8_4_ = auVar284._8_4_;
  auVar231._0_8_ = auVar284._0_8_;
  auVar231._12_4_ = auVar284._12_4_;
  auVar232 = minps(auVar231,auVar317);
  auVar189._8_4_ = auVar335._8_4_;
  auVar189._0_8_ = auVar335._0_8_;
  auVar189._12_4_ = auVar335._12_4_;
  auVar308 = minps(auVar189,auVar405);
  auVar232 = maxps(auVar232,auVar308);
  auVar190._8_4_ = auVar417._8_4_;
  auVar190._0_8_ = auVar417._0_8_;
  auVar190._12_4_ = auVar417._12_4_;
  auVar308 = minps(auVar190,auVar430);
  auVar163._4_4_ = uVar110;
  auVar163._0_4_ = uVar110;
  auVar163._8_4_ = uVar110;
  auVar163._12_4_ = uVar110;
  auVar308 = maxps(auVar308,auVar163);
  auVar308 = maxps(auVar232,auVar308);
  fVar188 = auVar308._0_4_ * 0.99999964;
  fVar212 = auVar308._4_4_ * 0.99999964;
  fVar213 = auVar308._8_4_ * 0.99999964;
  fVar216 = auVar308._12_4_ * 0.99999964;
  auVar308 = maxps(auVar284,auVar317);
  auVar232 = maxps(auVar335,auVar405);
  auVar308 = minps(auVar308,auVar232);
  auVar232 = maxps(auVar417,auVar430);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar191._4_4_ = uVar110;
  auVar191._0_4_ = uVar110;
  auVar191._8_4_ = uVar110;
  auVar191._12_4_ = uVar110;
  auVar232 = minps(auVar232,auVar191);
  auVar308 = minps(auVar308,auVar232);
  auVar192._0_4_ = -(uint)(PVar18 != (Primitive)0x0 && fVar188 <= auVar308._0_4_ * 1.0000004);
  auVar192._4_4_ = -(uint)(1 < (byte)PVar18 && fVar212 <= auVar308._4_4_ * 1.0000004);
  auVar192._8_4_ = -(uint)(2 < (byte)PVar18 && fVar213 <= auVar308._8_4_ * 1.0000004);
  auVar192._12_4_ = -(uint)(3 < (byte)PVar18 && fVar216 <= auVar308._12_4_ * 1.0000004);
  uVar123 = movmskps((int)(uVar111 * 0x18),auVar192);
  auVar193._0_12_ = mm_lookupmask_ps._240_12_;
  auVar193._12_4_ = 0;
LAB_0035db06:
  if (uVar123 == 0) {
LAB_0036036c:
    return uVar123 != 0;
  }
  lVar114 = 0;
  if (uVar123 != 0) {
    for (; (uVar123 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
    }
  }
  uVar125 = *(uint *)(prim + 2);
  uVar119 = (ulong)uVar125;
  uVar127 = *(uint *)(prim + lVar114 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar119].ptr;
  uVar120 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            (ulong)uVar127 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar243 = pGVar26->fnumTimeSegments;
  fVar245 = (pGVar26->time_range).lower;
  fVar245 = ((*(float *)(ray + k * 4 + 0x70) - fVar245) / ((pGVar26->time_range).upper - fVar245)) *
            fVar243;
  local_548 = fVar441;
  uStack_544 = fVar444;
  fVar441 = floorf(fVar245);
  fVar243 = fVar243 + -1.0;
  if (fVar243 <= fVar441) {
    fVar441 = fVar243;
  }
  fVar444 = 0.0;
  if (0.0 <= fVar441) {
    fVar444 = fVar441;
  }
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar117 = (long)(int)fVar444 * 0x38;
  lVar114 = *(long *)(_Var27 + 0x10 + uVar117);
  lVar28 = *(long *)(_Var27 + 0x38 + uVar117);
  lVar29 = *(long *)(_Var27 + 0x48 + uVar117);
  pfVar1 = (float *)(lVar28 + uVar120 * lVar29);
  pfVar2 = (float *)(lVar28 + (uVar120 + 1) * lVar29);
  pfVar3 = (float *)(lVar28 + (uVar120 + 2) * lVar29);
  fVar245 = fVar245 - fVar444;
  fVar300 = 1.0 - fVar245;
  pfVar4 = (float *)(lVar28 + lVar29 * (uVar120 + 3));
  pRVar115 = *(RTCIntersectArguments **)(_Var27 + uVar117);
  pSVar112 = (StackEntry *)(lVar114 * (uVar120 + 3));
  ppSVar5 = (Scene **)((long)&pRVar115->flags + lVar114 * uVar120);
  ppSVar6 = (Scene **)((long)&pRVar115->flags + lVar114 * (uVar120 + 1));
  ppSVar7 = (Scene **)((long)&pRVar115->flags + lVar114 * (uVar120 + 2));
  fVar351 = *(float *)ppSVar5 * fVar300 + *pfVar1 * fVar245;
  fVar215 = *(float *)((long)ppSVar5 + 4) * fVar300 + pfVar1[1] * fVar245;
  fVar329 = *(float *)(ppSVar5 + 1) * fVar300 + pfVar1[2] * fVar245;
  fVar358 = *(float *)ppSVar6 * fVar300 + *pfVar2 * fVar245;
  fVar374 = *(float *)((long)ppSVar6 + 4) * fVar300 + pfVar2[1] * fVar245;
  fVar376 = *(float *)(ppSVar6 + 1) * fVar300 + pfVar2[2] * fVar245;
  fVar392 = *(float *)ppSVar7 * fVar300 + *pfVar3 * fVar245;
  fVar333 = *(float *)((long)ppSVar7 + 4) * fVar300 + pfVar3[1] * fVar245;
  fVar408 = *(float *)(ppSVar7 + 1) * fVar300 + pfVar3[2] * fVar245;
  pfVar8 = (float *)((long)&(pSVar112->valid).field_0 + (long)&pRVar115->flags);
  local_5e8._0_4_ = fVar300 * *pfVar8 + fVar245 * *pfVar4;
  local_5e8._4_4_ = fVar300 * pfVar8[1] + fVar245 * pfVar4[1];
  fStack_5e0 = fVar300 * pfVar8[2] + fVar245 * pfVar4[2];
  fVar243 = *(float *)(ray + k * 4 + 0x40);
  fVar248 = *(float *)(ray + k * 4 + 0x50);
  fVar265 = *(float *)(ray + k * 4 + 0x60);
  fVar441 = fVar248 * fVar248;
  fVar444 = fVar265 * fVar265;
  fVar298 = fVar441 + fVar243 * fVar243 + fVar444;
  auVar164._0_8_ = CONCAT44(fVar441 + fVar441 + 0.0,fVar298);
  auVar164._8_4_ = fVar441 + fVar444 + fVar444;
  auVar164._12_4_ = fVar441 + 0.0 + 0.0;
  auVar318._8_4_ = auVar164._8_4_;
  auVar318._0_8_ = auVar164._0_8_;
  auVar318._12_4_ = auVar164._12_4_;
  auVar308 = rcpss(auVar318,auVar164);
  fVar341 = (2.0 - auVar308._0_4_ * fVar298) * auVar308._0_4_ *
            (((fVar329 + fVar376 + fVar408 + fStack_5e0) * 0.25 - *(float *)(ray + k * 4 + 0x20)) *
             fVar265 +
            ((fVar215 + fVar374 + fVar333 + (float)local_5e8._4_4_) * 0.25 -
            *(float *)(ray + k * 4 + 0x10)) * fVar248 +
            ((fVar351 + fVar358 + fVar392 + (float)local_5e8._0_4_) * 0.25 - *(float *)(ray + k * 4)
            ) * fVar243);
  fVar441 = fVar243 * fVar341 + *(float *)(ray + k * 4);
  fVar267 = fVar248 * fVar341 + *(float *)(ray + k * 4 + 0x10);
  fVar270 = fVar265 * fVar341 + *(float *)(ray + k * 4 + 0x20);
  fVar351 = fVar351 - fVar441;
  fVar215 = fVar215 - fVar267;
  fVar329 = fVar329 - fVar270;
  fVar446 = (*(float *)((long)ppSVar5 + 0xc) * fVar300 + pfVar1[3] * fVar245) - 0.0;
  fVar392 = fVar392 - fVar441;
  fVar333 = fVar333 - fVar267;
  fVar408 = fVar408 - fVar270;
  fVar395 = (*(float *)((long)ppSVar7 + 0xc) * fVar300 + pfVar3[3] * fVar245) - 0.0;
  fVar358 = fVar358 - fVar441;
  fVar374 = fVar374 - fVar267;
  fVar376 = fVar376 - fVar270;
  fVar379 = (*(float *)((long)ppSVar6 + 0xc) * fVar300 + pfVar2[3] * fVar245) - 0.0;
  local_5e8._0_4_ = (float)local_5e8._0_4_ - fVar441;
  local_5e8._4_4_ = (float)local_5e8._4_4_ - fVar267;
  fStack_5e0 = fStack_5e0 - fVar270;
  fStack_5dc = (fVar300 * pfVar8[3] + fVar245 * pfVar4[3]) - 0.0;
  fVar441 = fVar248 * fVar248;
  fVar421 = fVar243 * fVar243;
  fVar343 = fVar421 + fVar441 + fVar444;
  fVar399 = fVar421 + fVar441 + fVar444;
  fVar434 = fVar421 + fVar441 + fVar444;
  fVar421 = fVar421 + fVar441 + fVar444;
  local_578 = *(float *)(ray + k * 4 + 0x40);
  fVar303 = ABS(fVar343);
  fVar327 = ABS(fVar399);
  fVar332 = ABS(fVar434);
  fVar339 = ABS(fVar421);
  fVar245 = *(float *)(ray + k * 4 + 0x30);
  fVar300 = fVar245 - fVar341;
  uVar129 = 0;
  bVar121 = 0;
  uVar118 = 1;
  fVar267 = 0.0;
  fVar270 = 1.0;
  local_588 = fVar341;
  fStack_584 = fVar341;
  fStack_580 = fVar341;
  fStack_57c = fVar341;
  fStack_574 = local_578;
  fStack_570 = local_578;
  fStack_56c = local_578;
  fStack_540 = fVar408;
  fStack_53c = fVar395;
  fVar441 = fVar392;
  fVar444 = fVar333;
  do {
    uStack_5f2 = (undefined2)((uint)fVar374 >> 0x10);
    uStack_5f4 = SUB42(fVar374,0);
    fVar271 = fVar270 - fVar267;
    fVar449 = fVar271 * 0.0 + fVar267;
    fVar455 = fVar271 * 0.33333334 + fVar267;
    fVar456 = fVar271 * 0.6666667 + fVar267;
    fVar457 = fVar271 * 1.0 + fVar267;
    fVar415 = 1.0 - fVar449;
    fVar422 = 1.0 - fVar455;
    fVar423 = 1.0 - fVar456;
    fVar424 = 1.0 - fVar457;
    fVar304 = fVar358 * fVar415 + fVar392 * fVar449;
    fVar328 = fVar358 * fVar422 + fVar392 * fVar455;
    fVar330 = fVar358 * fVar423 + fVar392 * fVar456;
    fVar331 = fVar358 * fVar424 + fVar392 * fVar457;
    fVar272 = fVar374 * fVar415 + fVar333 * fVar449;
    fVar299 = fVar374 * fVar422 + fVar333 * fVar455;
    fVar301 = fVar374 * fVar423 + fVar333 * fVar456;
    fVar302 = fVar374 * fVar424 + fVar333 * fVar457;
    fVar217 = fVar376 * fVar415 + fVar408 * fVar449;
    fVar244 = fVar376 * fVar422 + fVar408 * fVar455;
    fVar246 = fVar376 * fVar423 + fVar408 * fVar456;
    fVar247 = fVar376 * fVar424 + fVar408 * fVar457;
    fVar345 = fVar379 * fVar415 + fVar395 * fVar449;
    fVar352 = fVar379 * fVar422 + fVar395 * fVar455;
    fVar354 = fVar379 * fVar423 + fVar395 * fVar456;
    fVar356 = fVar379 * fVar424 + fVar395 * fVar457;
    fVar442 = (fVar351 * fVar415 + fVar358 * fVar449) * fVar415 + fVar449 * fVar304;
    fVar445 = (fVar351 * fVar422 + fVar358 * fVar455) * fVar422 + fVar455 * fVar328;
    fVar447 = (fVar351 * fVar423 + fVar358 * fVar456) * fVar423 + fVar456 * fVar330;
    fVar448 = (fVar351 * fVar424 + fVar358 * fVar457) * fVar424 + fVar457 * fVar331;
    fVar380 = (fVar215 * fVar415 + fVar374 * fVar449) * fVar415 + fVar449 * fVar272;
    fVar393 = (fVar215 * fVar422 + fVar374 * fVar455) * fVar422 + fVar455 * fVar299;
    fVar396 = (fVar215 * fVar423 + fVar374 * fVar456) * fVar423 + fVar456 * fVar301;
    fVar400 = (fVar215 * fVar424 + fVar374 * fVar457) * fVar424 + fVar457 * fVar302;
    fVar249 = (fVar329 * fVar415 + fVar376 * fVar449) * fVar415 + fVar449 * fVar217;
    fVar266 = (fVar329 * fVar422 + fVar376 * fVar455) * fVar422 + fVar455 * fVar244;
    fVar268 = (fVar329 * fVar423 + fVar376 * fVar456) * fVar423 + fVar456 * fVar246;
    fVar269 = (fVar329 * fVar424 + fVar376 * fVar457) * fVar424 + fVar457 * fVar247;
    fVar334 = (fVar446 * fVar415 + fVar379 * fVar449) * fVar415 + fVar449 * fVar345;
    fVar340 = (fVar446 * fVar422 + fVar379 * fVar455) * fVar422 + fVar455 * fVar352;
    fVar342 = (fVar446 * fVar423 + fVar379 * fVar456) * fVar423 + fVar456 * fVar354;
    fVar344 = (fVar446 * fVar424 + fVar379 * fVar457) * fVar424 + fVar457 * fVar356;
    fVar304 = fVar304 * fVar415 + (fVar392 * fVar415 + (float)local_5e8._0_4_ * fVar449) * fVar449;
    fVar328 = fVar328 * fVar422 + (fVar392 * fVar422 + (float)local_5e8._0_4_ * fVar455) * fVar455;
    fVar330 = fVar330 * fVar423 + (fVar392 * fVar423 + (float)local_5e8._0_4_ * fVar456) * fVar456;
    fVar331 = fVar331 * fVar424 + (fVar392 * fVar424 + (float)local_5e8._0_4_ * fVar457) * fVar457;
    fVar272 = fVar272 * fVar415 + (fVar333 * fVar415 + (float)local_5e8._4_4_ * fVar449) * fVar449;
    fVar299 = fVar299 * fVar422 + (fVar333 * fVar422 + (float)local_5e8._4_4_ * fVar455) * fVar455;
    fVar301 = fVar301 * fVar423 + (fVar333 * fVar423 + (float)local_5e8._4_4_ * fVar456) * fVar456;
    fVar302 = fVar302 * fVar424 + (fVar333 * fVar424 + (float)local_5e8._4_4_ * fVar457) * fVar457;
    fVar217 = fVar217 * fVar415 + (fVar408 * fVar415 + fStack_5e0 * fVar449) * fVar449;
    fVar244 = fVar244 * fVar422 + (fVar408 * fVar422 + fStack_5e0 * fVar455) * fVar455;
    fVar246 = fVar246 * fVar423 + (fVar408 * fVar423 + fStack_5e0 * fVar456) * fVar456;
    fVar247 = fVar247 * fVar424 + (fVar408 * fVar424 + fStack_5e0 * fVar457) * fVar457;
    fVar346 = fVar345 * fVar415 + (fVar395 * fVar415 + fStack_5dc * fVar449) * fVar449;
    fVar353 = fVar352 * fVar422 + (fVar395 * fVar422 + fStack_5dc * fVar455) * fVar455;
    fVar355 = fVar354 * fVar423 + (fVar395 * fVar423 + fStack_5dc * fVar456) * fVar456;
    fVar357 = fVar356 * fVar424 + (fVar395 * fVar424 + fStack_5dc * fVar457) * fVar457;
    local_568 = fVar415 * fVar442 + fVar449 * fVar304;
    fStack_564 = fVar422 * fVar445 + fVar455 * fVar328;
    fStack_560 = fVar423 * fVar447 + fVar456 * fVar330;
    fStack_55c = fVar424 * fVar448 + fVar457 * fVar331;
    local_558 = fVar415 * fVar380 + fVar449 * fVar272;
    fStack_554 = fVar422 * fVar393 + fVar455 * fVar299;
    fStack_550 = fVar423 * fVar396 + fVar456 * fVar301;
    fStack_54c = fVar424 * fVar400 + fVar457 * fVar302;
    fVar425 = fVar415 * fVar249 + fVar449 * fVar217;
    fVar435 = fVar422 * fVar266 + fVar455 * fVar244;
    fVar437 = fVar423 * fVar268 + fVar456 * fVar246;
    fVar439 = fVar424 * fVar269 + fVar457 * fVar247;
    fVar359 = fVar271 * 0.11111111;
    fVar449 = fVar415 * fVar334 + fVar449 * fVar346;
    fVar455 = fVar422 * fVar340 + fVar455 * fVar353;
    auVar418._0_8_ = CONCAT44(fVar455,fVar449);
    auVar418._8_4_ = fVar423 * fVar342 + fVar456 * fVar355;
    auVar418._12_4_ = fVar424 * fVar344 + fVar457 * fVar357;
    fVar345 = (fVar304 - fVar442) * 3.0 * fVar359;
    fVar352 = (fVar328 - fVar445) * 3.0 * fVar359;
    fVar354 = (fVar330 - fVar447) * 3.0 * fVar359;
    fVar356 = (fVar331 - fVar448) * 3.0 * fVar359;
    fVar304 = (fVar272 - fVar380) * 3.0 * fVar359;
    fVar328 = (fVar299 - fVar393) * 3.0 * fVar359;
    fVar330 = (fVar301 - fVar396) * 3.0 * fVar359;
    fVar331 = (fVar302 - fVar400) * 3.0 * fVar359;
    fVar249 = (fVar217 - fVar249) * 3.0 * fVar359;
    fVar272 = (fVar244 - fVar266) * 3.0 * fVar359;
    fVar299 = (fVar246 - fVar268) * 3.0 * fVar359;
    fVar301 = (fVar247 - fVar269) * 3.0 * fVar359;
    fVar442 = fVar359 * (fVar353 - fVar340) * 3.0;
    fVar445 = fVar359 * (fVar355 - fVar342) * 3.0;
    fVar447 = fVar359 * (fVar357 - fVar344) * 3.0;
    auVar194._4_4_ = auVar418._8_4_;
    auVar194._0_4_ = fVar455;
    auVar194._8_4_ = auVar418._12_4_;
    auVar194._12_4_ = 0;
    local_698._4_4_ = fVar455 + fVar442;
    local_698._0_4_ = fVar449 + fVar359 * (fVar346 - fVar334) * 3.0;
    fStack_690 = auVar418._8_4_ + fVar445;
    fStack_68c = auVar418._12_4_ + fVar447;
    auVar195._0_8_ = CONCAT44(auVar418._8_4_ - fVar445,fVar455 - fVar442);
    auVar195._8_4_ = auVar418._12_4_ - fVar447;
    auVar195._12_4_ = 0;
    fVar403 = fStack_554 - local_558;
    fVar409 = fStack_550 - fStack_554;
    fVar411 = fStack_54c - fStack_550;
    fVar413 = 0.0 - fStack_54c;
    fVar422 = fVar435 - fVar425;
    fVar424 = fVar437 - fVar435;
    fVar397 = fVar439 - fVar437;
    fVar401 = 0.0 - fVar439;
    fVar442 = fVar304 * fVar422 - fVar249 * fVar403;
    fVar445 = fVar328 * fVar424 - fVar272 * fVar409;
    fVar447 = fVar330 * fVar397 - fVar299 * fVar411;
    fVar448 = fVar331 * fVar401 - fVar301 * fVar413;
    auVar458._0_4_ = fStack_564 - local_568;
    auVar458._4_4_ = fStack_560 - fStack_564;
    auVar458._8_4_ = fStack_55c - fStack_560;
    auVar458._12_4_ = 0.0 - fStack_55c;
    fVar217 = fVar249 * auVar458._0_4_ - fVar345 * fVar422;
    fVar244 = fVar272 * auVar458._4_4_ - fVar352 * fVar424;
    fVar246 = fVar299 * auVar458._8_4_ - fVar354 * fVar397;
    fVar247 = fVar301 * auVar458._12_4_ - fVar356 * fVar401;
    fVar266 = fVar345 * fVar403 - fVar304 * auVar458._0_4_;
    fVar268 = fVar352 * fVar409 - fVar328 * auVar458._4_4_;
    fVar269 = fVar354 * fVar411 - fVar330 * auVar458._8_4_;
    fVar302 = fVar356 * fVar413 - fVar331 * auVar458._12_4_;
    auVar253._0_4_ = fVar422 * fVar422;
    auVar253._4_4_ = fVar424 * fVar424;
    auVar253._8_4_ = fVar397 * fVar397;
    auVar253._12_4_ = fVar401 * fVar401;
    auVar336._0_4_ = auVar458._0_4_ * auVar458._0_4_ + fVar403 * fVar403 + auVar253._0_4_;
    auVar336._4_4_ = auVar458._4_4_ * auVar458._4_4_ + fVar409 * fVar409 + auVar253._4_4_;
    auVar336._8_4_ = auVar458._8_4_ * auVar458._8_4_ + fVar411 * fVar411 + auVar253._8_4_;
    auVar336._12_4_ = auVar458._12_4_ * auVar458._12_4_ + fVar413 * fVar413 + auVar253._12_4_;
    auVar308 = rcpps(auVar253,auVar336);
    fVar449 = auVar308._0_4_;
    fVar455 = auVar308._4_4_;
    fVar456 = auVar308._8_4_;
    fVar457 = auVar308._12_4_;
    fVar449 = (1.0 - fVar449 * auVar336._0_4_) * fVar449 + fVar449;
    fVar455 = (1.0 - fVar455 * auVar336._4_4_) * fVar455 + fVar455;
    fVar456 = (1.0 - fVar456 * auVar336._8_4_) * fVar456 + fVar456;
    fVar457 = (1.0 - fVar457 * auVar336._12_4_) * fVar457 + fVar457;
    fVar334 = fVar422 * fVar328 - fVar403 * fVar272;
    fVar340 = fVar424 * fVar330 - fVar409 * fVar299;
    fVar342 = fVar397 * fVar331 - fVar411 * fVar301;
    fVar344 = fVar401 * 0.0 - fVar413 * 0.0;
    fVar346 = auVar458._0_4_ * fVar272 - fVar422 * fVar352;
    fVar353 = auVar458._4_4_ * fVar299 - fVar424 * fVar354;
    fVar355 = auVar458._8_4_ * fVar301 - fVar397 * fVar356;
    fVar357 = auVar458._12_4_ * 0.0 - fVar401 * 0.0;
    fVar359 = fVar403 * fVar352 - auVar458._0_4_ * fVar328;
    fVar380 = fVar409 * fVar354 - auVar458._4_4_ * fVar330;
    fVar393 = fVar411 * fVar356 - auVar458._8_4_ * fVar331;
    fVar396 = fVar413 * 0.0 - auVar458._12_4_ * 0.0;
    auVar451._0_4_ = fVar359 * fVar359;
    auVar451._4_4_ = fVar380 * fVar380;
    auVar451._8_4_ = fVar393 * fVar393;
    auVar451._12_4_ = fVar396 * fVar396;
    auVar165._0_4_ = (fVar442 * fVar442 + fVar217 * fVar217 + fVar266 * fVar266) * fVar449;
    auVar165._4_4_ = (fVar445 * fVar445 + fVar244 * fVar244 + fVar268 * fVar268) * fVar455;
    auVar165._8_4_ = (fVar447 * fVar447 + fVar246 * fVar246 + fVar269 * fVar269) * fVar456;
    auVar165._12_4_ = (fVar448 * fVar448 + fVar247 * fVar247 + fVar302 * fVar302) * fVar457;
    auVar364._0_4_ = (fVar334 * fVar334 + fVar346 * fVar346 + auVar451._0_4_) * fVar449;
    auVar364._4_4_ = (fVar340 * fVar340 + fVar353 * fVar353 + auVar451._4_4_) * fVar455;
    auVar364._8_4_ = (fVar342 * fVar342 + fVar355 * fVar355 + auVar451._8_4_) * fVar456;
    auVar364._12_4_ = (fVar344 * fVar344 + fVar357 * fVar357 + auVar451._12_4_) * fVar457;
    auVar308 = maxps(auVar165,auVar364);
    auVar347._8_4_ = auVar418._8_4_;
    auVar347._0_8_ = auVar418._0_8_;
    auVar347._12_4_ = auVar418._12_4_;
    auVar232 = maxps(auVar347,_local_698);
    auVar365._8_4_ = auVar195._8_4_;
    auVar365._0_8_ = auVar195._0_8_;
    auVar365._12_4_ = 0;
    auVar366 = maxps(auVar365,auVar194);
    auVar366 = maxps(auVar232,auVar366);
    auVar419 = minps(auVar418,_local_698);
    auVar232 = minps(auVar195,auVar194);
    auVar232 = minps(auVar419,auVar232);
    auVar308 = sqrtps(auVar308,auVar308);
    auVar419 = rsqrtps(auVar451,auVar336);
    fVar442 = auVar419._0_4_;
    fVar445 = auVar419._4_4_;
    fVar448 = auVar419._8_4_;
    fVar449 = auVar419._12_4_;
    fVar447 = fVar442 * fVar442 * auVar336._0_4_ * -0.5 * fVar442 + fVar442 * 1.5;
    fVar455 = fVar445 * fVar445 * auVar336._4_4_ * -0.5 * fVar445 + fVar445 * 1.5;
    fVar217 = fVar448 * fVar448 * auVar336._8_4_ * -0.5 * fVar448 + fVar448 * 1.5;
    fVar247 = fVar449 * fVar449 * auVar336._12_4_ * -0.5 * fVar449 + fVar449 * 1.5;
    fVar359 = 0.0 - local_558;
    fVar380 = 0.0 - fStack_554;
    fVar393 = 0.0 - fStack_550;
    fVar400 = 0.0 - fStack_54c;
    fVar442 = 0.0 - fVar425;
    fVar448 = 0.0 - fVar435;
    fVar456 = 0.0 - fVar437;
    fVar244 = 0.0 - fVar439;
    fVar334 = 0.0 - local_568;
    fVar342 = 0.0 - fStack_564;
    fVar346 = 0.0 - fStack_560;
    fVar355 = 0.0 - fStack_55c;
    fVar423 = local_578 * auVar458._0_4_ * fVar447 +
              fVar248 * fVar403 * fVar447 + fVar265 * fVar422 * fVar447;
    fVar394 = fStack_574 * auVar458._4_4_ * fVar455 +
              fVar248 * fVar409 * fVar455 + fVar265 * fVar424 * fVar455;
    fVar398 = fStack_570 * auVar458._8_4_ * fVar217 +
              fVar248 * fVar411 * fVar217 + fVar265 * fVar397 * fVar217;
    fVar402 = fStack_56c * auVar458._12_4_ * fVar247 +
              fVar248 * fVar413 * fVar247 + fVar265 * fVar401 * fVar247;
    fVar404 = auVar458._0_4_ * fVar447 * fVar334 +
              fVar403 * fVar447 * fVar359 + fVar422 * fVar447 * fVar442;
    fVar410 = auVar458._4_4_ * fVar455 * fVar342 +
              fVar409 * fVar455 * fVar380 + fVar424 * fVar455 * fVar448;
    fVar412 = auVar458._8_4_ * fVar217 * fVar346 +
              fVar411 * fVar217 * fVar393 + fVar397 * fVar217 * fVar456;
    fVar414 = auVar458._12_4_ * fVar247 * fVar355 +
              fVar413 * fVar247 * fVar400 + fVar401 * fVar247 * fVar244;
    fVar266 = (local_578 * fVar334 + fVar248 * fVar359 + fVar265 * fVar442) - fVar423 * fVar404;
    fVar268 = (fStack_574 * fVar342 + fVar248 * fVar380 + fVar265 * fVar448) - fVar394 * fVar410;
    fVar269 = (fStack_570 * fVar346 + fVar248 * fVar393 + fVar265 * fVar456) - fVar398 * fVar412;
    fVar302 = (fStack_56c * fVar355 + fVar248 * fVar400 + fVar265 * fVar244) - fVar402 * fVar414;
    fVar445 = (fVar334 * fVar334 + fVar359 * fVar359 + fVar442 * fVar442) - fVar404 * fVar404;
    fVar449 = (fVar342 * fVar342 + fVar380 * fVar380 + fVar448 * fVar448) - fVar410 * fVar410;
    fVar457 = (fVar346 * fVar346 + fVar393 * fVar393 + fVar456 * fVar456) - fVar412 * fVar412;
    fVar246 = (fVar355 * fVar355 + fVar400 * fVar400 + fVar244 * fVar244) - fVar414 * fVar414;
    fVar340 = (auVar366._0_4_ + auVar308._0_4_) * 1.0000002;
    fVar344 = (auVar366._4_4_ + auVar308._4_4_) * 1.0000002;
    fVar353 = (auVar366._8_4_ + auVar308._8_4_) * 1.0000002;
    fVar357 = (auVar366._12_4_ + auVar308._12_4_) * 1.0000002;
    fVar340 = fVar445 - fVar340 * fVar340;
    fVar344 = fVar449 - fVar344 * fVar344;
    fVar353 = fVar457 - fVar353 * fVar353;
    fVar357 = fVar246 - fVar357 * fVar357;
    auVar367._0_4_ = fVar343 - fVar423 * fVar423;
    auVar367._4_4_ = fVar399 - fVar394 * fVar394;
    auVar367._8_4_ = fVar434 - fVar398 * fVar398;
    auVar367._12_4_ = fVar421 - fVar402 * fVar402;
    fVar266 = fVar266 + fVar266;
    fVar268 = fVar268 + fVar268;
    fVar269 = fVar269 + fVar269;
    fVar302 = fVar302 + fVar302;
    local_598._0_4_ = auVar367._0_4_ * 4.0;
    local_598._4_4_ = auVar367._4_4_ * 4.0;
    fStack_590 = auVar367._8_4_ * 4.0;
    fStack_58c = auVar367._12_4_ * 4.0;
    auVar348._0_4_ = fVar266 * fVar266 - (float)local_598._0_4_ * fVar340;
    auVar348._4_4_ = fVar268 * fVar268 - (float)local_598._4_4_ * fVar344;
    auVar348._8_4_ = fVar269 * fVar269 - fStack_590 * fVar353;
    auVar348._12_4_ = fVar302 * fVar302 - fStack_58c * fVar357;
    local_648._4_4_ = (auVar232._4_4_ - auVar308._4_4_) * 0.99999976;
    local_648._0_4_ = (auVar232._0_4_ - auVar308._0_4_) * 0.99999976;
    fStack_640 = (auVar232._8_4_ - auVar308._8_4_) * 0.99999976;
    fStack_63c = (auVar232._12_4_ - auVar308._12_4_) * 0.99999976;
    auVar285._4_4_ = -(uint)(0.0 <= auVar348._4_4_);
    auVar285._0_4_ = -(uint)(0.0 <= auVar348._0_4_);
    auVar285._8_4_ = -(uint)(0.0 <= auVar348._8_4_);
    auVar285._12_4_ = -(uint)(0.0 <= auVar348._12_4_);
    iVar132 = movmskps((int)pSVar112,auVar285);
    uVar416 = CONCAT44(fVar268,fVar266) ^ 0x8000000080000000;
    auVar166._0_8_ = CONCAT44(fVar394 * fVar394,fVar423 * fVar423) & 0x7fffffff7fffffff;
    auVar166._8_4_ = ABS(fVar398 * fVar398);
    auVar166._12_4_ = ABS(fVar402 * fVar402);
    uVar120 = CONCAT44(auVar367._4_4_,auVar367._0_4_);
    fVar396 = ABS(auVar367._8_4_);
    fVar415 = ABS(auVar367._12_4_);
    if (iVar132 == 0) {
      iVar132 = 0;
      auVar369 = _DAT_01f45a40;
      auVar452 = _DAT_01f45a30;
    }
    else {
      auVar232 = sqrtps(auVar458,auVar348);
      bVar122 = 0.0 <= auVar348._0_4_;
      uVar124 = -(uint)bVar122;
      bVar31 = 0.0 <= auVar348._4_4_;
      uVar126 = -(uint)bVar31;
      bVar32 = 0.0 <= auVar348._8_4_;
      uVar128 = -(uint)bVar32;
      bVar33 = 0.0 <= auVar348._12_4_;
      uVar130 = -(uint)bVar33;
      auVar196._0_4_ = auVar367._0_4_ + auVar367._0_4_;
      auVar196._4_4_ = auVar367._4_4_ + auVar367._4_4_;
      auVar196._8_4_ = auVar367._8_4_ + auVar367._8_4_;
      auVar196._12_4_ = auVar367._12_4_ + auVar367._12_4_;
      auVar308 = rcpps(auVar367,auVar196);
      fVar426 = auVar308._0_4_;
      fVar436 = auVar308._4_4_;
      fVar438 = auVar308._8_4_;
      fVar440 = auVar308._12_4_;
      fVar426 = (1.0 - auVar196._0_4_ * fVar426) * fVar426 + fVar426;
      fVar436 = (1.0 - auVar196._4_4_ * fVar436) * fVar436 + fVar436;
      fVar438 = (1.0 - auVar196._8_4_ * fVar438) * fVar438 + fVar438;
      fVar440 = (1.0 - auVar196._12_4_ * fVar440) * fVar440 + fVar440;
      fVar360 = (-fVar266 - auVar232._0_4_) * fVar426;
      fVar375 = (-fVar268 - auVar232._4_4_) * fVar436;
      fVar377 = (-fVar269 - auVar232._8_4_) * fVar438;
      fVar378 = (-fVar302 - auVar232._12_4_) * fVar440;
      fVar426 = (auVar232._0_4_ - fVar266) * fVar426;
      fVar436 = (auVar232._4_4_ - fVar268) * fVar436;
      fVar438 = (auVar232._8_4_ - fVar269) * fVar438;
      fVar440 = (auVar232._12_4_ - fVar302) * fVar440;
      local_218 = (fVar423 * fVar360 + fVar404) * fVar447;
      fStack_214 = (fVar394 * fVar375 + fVar410) * fVar455;
      fStack_210 = (fVar398 * fVar377 + fVar412) * fVar217;
      fStack_20c = (fVar402 * fVar378 + fVar414) * fVar247;
      local_208 = (fVar423 * fVar426 + fVar404) * fVar447;
      fStack_204 = (fVar394 * fVar436 + fVar410) * fVar455;
      fStack_200 = (fVar398 * fVar438 + fVar412) * fVar217;
      fStack_1fc = (fVar402 * fVar440 + fVar414) * fVar247;
      auVar368._0_4_ = (uint)fVar360 & uVar124;
      auVar368._4_4_ = (uint)fVar375 & uVar126;
      auVar368._8_4_ = (uint)fVar377 & uVar128;
      auVar368._12_4_ = (uint)fVar378 & uVar130;
      auVar452._0_8_ = CONCAT44(~uVar126,~uVar124) & 0x7f8000007f800000;
      auVar452._8_4_ = ~uVar128 & 0x7f800000;
      auVar452._12_4_ = ~uVar130 & 0x7f800000;
      auVar452 = auVar452 | auVar368;
      auVar459._0_4_ = (uint)fVar426 & uVar124;
      auVar459._4_4_ = (uint)fVar436 & uVar126;
      auVar459._8_4_ = (uint)fVar438 & uVar128;
      auVar459._12_4_ = (uint)fVar440 & uVar130;
      auVar369._0_8_ = CONCAT44(~uVar126,~uVar124) & 0xff800000ff800000;
      auVar369._8_4_ = ~uVar128 & 0xff800000;
      auVar369._12_4_ = ~uVar130 & 0xff800000;
      auVar369 = auVar369 | auVar459;
      auVar78._4_4_ = fVar327;
      auVar78._0_4_ = fVar303;
      auVar78._8_4_ = fVar332;
      auVar78._12_4_ = fVar339;
      auVar308 = maxps(auVar78,auVar166);
      fVar426 = auVar308._0_4_ * 1.9073486e-06;
      fVar360 = auVar308._4_4_ * 1.9073486e-06;
      fVar436 = auVar308._8_4_ * 1.9073486e-06;
      fVar375 = auVar308._12_4_ * 1.9073486e-06;
      auVar460._0_4_ = -(uint)(ABS(auVar367._0_4_) < fVar426 && bVar122);
      auVar460._4_4_ = -(uint)(ABS(auVar367._4_4_) < fVar360 && bVar31);
      auVar460._8_4_ = -(uint)(fVar396 < fVar436 && bVar32);
      auVar460._12_4_ = -(uint)(fVar415 < fVar375 && bVar33);
      iVar132 = movmskps(iVar132,auVar460);
      if (iVar132 != 0) {
        uVar124 = -(uint)(fVar340 <= 0.0);
        uVar126 = -(uint)(fVar344 <= 0.0);
        uVar128 = -(uint)(fVar353 <= 0.0);
        uVar130 = -(uint)(fVar357 <= 0.0);
        auVar286._0_4_ = (uVar124 & 0xff800000 | ~uVar124 & 0x7f800000) & auVar460._0_4_;
        auVar286._4_4_ = (uVar126 & 0xff800000 | ~uVar126 & 0x7f800000) & auVar460._4_4_;
        auVar286._8_4_ = (uVar128 & 0xff800000 | ~uVar128 & 0x7f800000) & auVar460._8_4_;
        auVar286._12_4_ = (uVar130 & 0xff800000 | ~uVar130 & 0x7f800000) & auVar460._12_4_;
        auVar443._0_4_ = ~auVar460._0_4_ & auVar452._0_4_;
        auVar443._4_4_ = ~auVar460._4_4_ & auVar452._4_4_;
        auVar443._8_4_ = ~auVar460._8_4_ & auVar452._8_4_;
        auVar443._12_4_ = ~auVar460._12_4_ & auVar452._12_4_;
        auVar453._0_4_ = (uVar124 & 0x7f800000 | ~uVar124 & 0xff800000) & auVar460._0_4_;
        auVar453._4_4_ = (uVar126 & 0x7f800000 | ~uVar126 & 0xff800000) & auVar460._4_4_;
        auVar453._8_4_ = (uVar128 & 0x7f800000 | ~uVar128 & 0xff800000) & auVar460._8_4_;
        auVar453._12_4_ = (uVar130 & 0x7f800000 | ~uVar130 & 0xff800000) & auVar460._12_4_;
        auVar461._0_4_ = ~auVar460._0_4_ & auVar369._0_4_;
        auVar461._4_4_ = ~auVar460._4_4_ & auVar369._4_4_;
        auVar461._8_4_ = ~auVar460._8_4_ & auVar369._8_4_;
        auVar461._12_4_ = ~auVar460._12_4_ & auVar369._12_4_;
        auVar285._4_4_ = -(uint)((fVar360 <= ABS(auVar367._4_4_) || fVar344 <= 0.0) && bVar31);
        auVar285._0_4_ = -(uint)((fVar426 <= ABS(auVar367._0_4_) || fVar340 <= 0.0) && bVar122);
        auVar285._8_4_ = -(uint)((fVar436 <= fVar396 || fVar353 <= 0.0) && bVar32);
        auVar285._12_4_ = -(uint)((fVar375 <= fVar415 || fVar357 <= 0.0) && bVar33);
        auVar369 = auVar461 | auVar453;
        auVar452 = auVar443 | auVar286;
      }
    }
    auVar287._0_4_ = (auVar285._0_4_ << 0x1f) >> 0x1f;
    auVar287._4_4_ = (auVar285._4_4_ << 0x1f) >> 0x1f;
    auVar287._8_4_ = (auVar285._8_4_ << 0x1f) >> 0x1f;
    auVar287._12_4_ = (auVar285._12_4_ << 0x1f) >> 0x1f;
    auVar287 = auVar287 & auVar193;
    iVar132 = movmskps(iVar132,auVar287);
    pRVar116 = pRVar115;
    fVar340 = local_588;
    fVar344 = fStack_584;
    fVar353 = fStack_580;
    fVar357 = fStack_57c;
    if (iVar132 != 0) {
      fVar426 = *(float *)(ray + k * 4 + 0x80);
      auVar431._0_4_ = fVar426 - fVar341;
      auVar431._4_4_ = auVar431._0_4_;
      auVar431._8_4_ = auVar431._0_4_;
      auVar431._12_4_ = auVar431._0_4_;
      auVar366 = minps(auVar431,auVar369);
      auVar82._4_4_ = fVar300;
      auVar82._0_4_ = fVar300;
      auVar82._8_4_ = fVar300;
      auVar82._12_4_ = fVar300;
      auVar232 = maxps(auVar82,auVar452);
      auVar167._0_4_ = fVar442 * fVar249;
      auVar167._4_4_ = fVar448 * fVar272;
      auVar167._8_4_ = fVar456 * fVar299;
      auVar167._12_4_ = fVar244 * fVar301;
      auVar233._0_4_ = fVar345 * local_578 + fVar304 * fVar248 + fVar249 * fVar265;
      auVar233._4_4_ = fVar352 * fStack_574 + fVar328 * fVar248 + fVar272 * fVar265;
      auVar233._8_4_ = fVar354 * fStack_570 + fVar330 * fVar248 + fVar299 * fVar265;
      auVar233._12_4_ = fVar356 * fStack_56c + fVar331 * fVar248 + fVar301 * fVar265;
      auVar308 = rcpps(auVar167,auVar233);
      fVar442 = auVar308._0_4_;
      fVar448 = auVar308._4_4_;
      fVar456 = auVar308._8_4_;
      fVar244 = auVar308._12_4_;
      fVar442 = ((1.0 - auVar233._0_4_ * fVar442) * fVar442 + fVar442) *
                -(fVar334 * fVar345 + fVar359 * fVar304 + auVar167._0_4_);
      fVar448 = ((1.0 - auVar233._4_4_ * fVar448) * fVar448 + fVar448) *
                -(fVar342 * fVar352 + fVar380 * fVar328 + auVar167._4_4_);
      fVar456 = ((1.0 - auVar233._8_4_ * fVar456) * fVar456 + fVar456) *
                -(fVar346 * fVar354 + fVar393 * fVar330 + auVar167._8_4_);
      fVar244 = ((1.0 - auVar233._12_4_ * fVar244) * fVar244 + fVar244) *
                -(fVar355 * fVar356 + fVar400 * fVar331 + auVar167._12_4_);
      uVar124 = -(uint)(auVar233._0_4_ < 0.0 || ABS(auVar233._0_4_) < 1e-18);
      uVar126 = -(uint)(auVar233._4_4_ < 0.0 || ABS(auVar233._4_4_) < 1e-18);
      uVar128 = -(uint)(auVar233._8_4_ < 0.0 || ABS(auVar233._8_4_) < 1e-18);
      uVar130 = -(uint)(auVar233._12_4_ < 0.0 || ABS(auVar233._12_4_) < 1e-18);
      auVar337._0_4_ = (uint)DAT_01f45a40 & uVar124;
      auVar337._4_4_ = DAT_01f45a40._4_4_ & uVar126;
      auVar337._8_4_ = DAT_01f45a40._8_4_ & uVar128;
      auVar337._12_4_ = DAT_01f45a40._12_4_ & uVar130;
      auVar168._0_4_ = ~uVar124 & (uint)fVar442;
      auVar168._4_4_ = ~uVar126 & (uint)fVar448;
      auVar168._8_4_ = ~uVar128 & (uint)fVar456;
      auVar168._12_4_ = ~uVar130 & (uint)fVar244;
      auVar232 = maxps(auVar232,auVar168 | auVar337);
      uVar124 = -(uint)(0.0 < auVar233._0_4_ || ABS(auVar233._0_4_) < 1e-18);
      uVar126 = -(uint)(0.0 < auVar233._4_4_ || ABS(auVar233._4_4_) < 1e-18);
      uVar128 = -(uint)(0.0 < auVar233._8_4_ || ABS(auVar233._8_4_) < 1e-18);
      uVar130 = -(uint)(0.0 < auVar233._12_4_ || ABS(auVar233._12_4_) < 1e-18);
      auVar169._0_8_ = CONCAT44(uVar126,uVar124) & 0x7f8000007f800000;
      auVar169._8_4_ = uVar128 & 0x7f800000;
      auVar169._12_4_ = uVar130 & 0x7f800000;
      auVar234._0_4_ = ~uVar124 & (uint)fVar442;
      auVar234._4_4_ = ~uVar126 & (uint)fVar448;
      auVar234._8_4_ = ~uVar128 & (uint)fVar456;
      auVar234._12_4_ = ~uVar130 & (uint)fVar244;
      auVar366 = minps(auVar366,auVar234 | auVar169);
      auVar319._0_4_ = (0.0 - fStack_554) * -fVar328 + (0.0 - fVar435) * -fVar272;
      auVar319._4_4_ = (0.0 - fStack_550) * -fVar330 + (0.0 - fVar437) * -fVar299;
      auVar319._8_4_ = (0.0 - fStack_54c) * -fVar331 + (0.0 - fVar439) * -fVar301;
      auVar319._12_4_ = 0x80000000;
      auVar254._0_4_ = -fVar352 * local_578 + -fVar328 * fVar248 + -fVar272 * fVar265;
      auVar254._4_4_ = -fVar354 * fStack_574 + -fVar330 * fVar248 + -fVar299 * fVar265;
      auVar254._8_4_ = -fVar356 * fStack_570 + -fVar331 * fVar248 + -fVar301 * fVar265;
      auVar254._12_4_ = fStack_56c * -0.0 + fVar248 * -0.0 + fVar265 * -0.0;
      auVar308 = rcpps(auVar319,auVar254);
      fVar442 = auVar308._0_4_;
      fVar448 = auVar308._4_4_;
      fVar456 = auVar308._8_4_;
      fVar244 = auVar308._12_4_;
      auVar338._4_4_ = -(uint)(ABS(auVar254._4_4_) < 1e-18);
      auVar338._0_4_ = -(uint)(ABS(auVar254._0_4_) < 1e-18);
      auVar338._8_4_ = -(uint)(ABS(auVar254._8_4_) < 1e-18);
      auVar338._12_4_ = -(uint)(ABS(auVar254._12_4_) < 1e-18);
      fVar442 = (((float)DAT_01f46a60 - auVar254._0_4_ * fVar442) * fVar442 + fVar442) *
                -((0.0 - fStack_564) * -fVar352 + auVar319._0_4_);
      fVar448 = ((DAT_01f46a60._4_4_ - auVar254._4_4_ * fVar448) * fVar448 + fVar448) *
                -((0.0 - fStack_560) * -fVar354 + auVar319._4_4_);
      fVar456 = ((DAT_01f46a60._8_4_ - auVar254._8_4_ * fVar456) * fVar456 + fVar456) *
                -((0.0 - fStack_55c) * -fVar356 + auVar319._8_4_);
      fVar244 = ((DAT_01f46a60._12_4_ - auVar254._12_4_ * fVar244) * fVar244 + fVar244) * 0.0;
      auVar170._4_4_ = -(uint)(auVar254._4_4_ < 0.0);
      auVar170._0_4_ = -(uint)(auVar254._0_4_ < 0.0);
      auVar170._8_4_ = -(uint)(auVar254._8_4_ < 0.0);
      auVar170._12_4_ = -(uint)(auVar254._12_4_ < 0.0);
      auVar170 = auVar170 | auVar338;
      auVar320._0_4_ = (uint)DAT_01f45a40 & auVar170._0_4_;
      auVar320._4_4_ = DAT_01f45a40._4_4_ & auVar170._4_4_;
      auVar320._8_4_ = DAT_01f45a40._8_4_ & auVar170._8_4_;
      auVar320._12_4_ = DAT_01f45a40._12_4_ & auVar170._12_4_;
      auVar171._0_4_ = ~auVar170._0_4_ & (uint)fVar442;
      auVar171._4_4_ = ~auVar170._4_4_ & (uint)fVar448;
      auVar171._8_4_ = ~auVar170._8_4_ & (uint)fVar456;
      auVar171._12_4_ = ~auVar170._12_4_ & (uint)fVar244;
      auVar308 = maxps(auVar232,auVar171 | auVar320);
      auVar255._4_4_ = -(uint)(0.0 < auVar254._4_4_);
      auVar255._0_4_ = -(uint)(0.0 < auVar254._0_4_);
      auVar255._8_4_ = -(uint)(0.0 < auVar254._8_4_);
      auVar255._12_4_ = -(uint)(0.0 < auVar254._12_4_);
      auVar255 = auVar255 | auVar338;
      auVar406._0_8_ = auVar255._0_8_ & 0x7f8000007f800000;
      auVar406._8_4_ = auVar255._8_4_ & 0x7f800000;
      auVar406._12_4_ = auVar255._12_4_ & 0x7f800000;
      auVar256._0_4_ = ~auVar255._0_4_ & (uint)fVar442;
      auVar256._4_4_ = ~auVar255._4_4_ & (uint)fVar448;
      auVar256._8_4_ = ~auVar255._8_4_ & (uint)fVar456;
      auVar256._12_4_ = ~auVar255._12_4_ & (uint)fVar244;
      aVar432 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar366,auVar256 | auVar406);
      fVar442 = auVar308._0_4_;
      fVar448 = auVar308._12_4_;
      fVar456 = auVar308._4_4_;
      fVar244 = auVar308._8_4_;
      auVar462._0_4_ = -(uint)(fVar442 <= aVar432.v[0]) & auVar287._0_4_;
      auVar462._4_4_ = -(uint)(fVar456 <= aVar432.v[1]) & auVar287._4_4_;
      auVar462._8_4_ = -(uint)(fVar244 <= aVar432.v[2]) & auVar287._8_4_;
      auVar462._12_4_ = -(uint)(fVar448 <= aVar432.v[3]) & auVar287._12_4_;
      iVar132 = movmskps(iVar132,auVar462);
      if (iVar132 != 0) {
        auVar366 = maxps(ZEXT816(0),_local_648);
        auVar80._4_4_ = fStack_214;
        auVar80._0_4_ = local_218;
        auVar80._8_4_ = fStack_210;
        auVar80._12_4_ = fStack_20c;
        auVar232 = minps(auVar80,_DAT_01f46a60);
        auVar288._0_12_ = ZEXT812(0);
        auVar288._12_4_ = 0;
        auVar419 = maxps(auVar232,auVar288);
        auVar81._4_4_ = fStack_204;
        auVar81._0_4_ = local_208;
        auVar81._8_4_ = fStack_200;
        auVar81._12_4_ = fStack_1fc;
        auVar232 = minps(auVar81,_DAT_01f46a60);
        auVar232 = maxps(auVar232,auVar288);
        local_108._0_4_ = (auVar419._0_4_ + 0.0) * 0.25 * fVar271 + fVar267;
        local_108._4_4_ = (auVar419._4_4_ + 1.0) * 0.25 * fVar271 + fVar267;
        local_108._8_4_ = (auVar419._8_4_ + 2.0) * 0.25 * fVar271 + fVar267;
        local_108._12_4_ = (auVar419._12_4_ + 3.0) * 0.25 * fVar271 + fVar267;
        local_118[0] = (auVar232._0_4_ + 0.0) * 0.25 * fVar271 + fVar267;
        local_118[1] = (auVar232._4_4_ + 1.0) * 0.25 * fVar271 + fVar267;
        local_118[2] = (auVar232._8_4_ + 2.0) * 0.25 * fVar271 + fVar267;
        local_118[3] = (auVar232._12_4_ + 3.0) * 0.25 * fVar271 + fVar267;
        fVar445 = fVar445 - auVar366._0_4_ * auVar366._0_4_;
        fVar449 = fVar449 - auVar366._4_4_ * auVar366._4_4_;
        fVar457 = fVar457 - auVar366._8_4_ * auVar366._8_4_;
        fVar246 = fVar246 - auVar366._12_4_ * auVar366._12_4_;
        auVar235._0_4_ = (float)local_598._0_4_ * fVar445;
        auVar235._4_4_ = (float)local_598._4_4_ * fVar449;
        auVar235._8_4_ = fStack_590 * fVar457;
        auVar235._12_4_ = fStack_58c * fVar246;
        auVar197._0_4_ = fVar266 * fVar266 - auVar235._0_4_;
        auVar197._4_4_ = fVar268 * fVar268 - auVar235._4_4_;
        auVar197._8_4_ = fVar269 * fVar269 - auVar235._8_4_;
        auVar197._12_4_ = fVar302 * fVar302 - auVar235._12_4_;
        auVar454._4_4_ = -(uint)(0.0 <= auVar197._4_4_);
        auVar454._0_4_ = -(uint)(0.0 <= auVar197._0_4_);
        auVar454._8_4_ = -(uint)(0.0 <= auVar197._8_4_);
        auVar454._12_4_ = -(uint)(0.0 <= auVar197._12_4_);
        iVar132 = movmskps(iVar132,auVar454);
        if (iVar132 == 0) {
          _local_648 = ZEXT816(0);
          fVar299 = 0.0;
          fVar269 = 0.0;
          fVar301 = 0.0;
          fVar302 = 0.0;
          fVar447 = 0.0;
          fVar455 = 0.0;
          fVar217 = 0.0;
          fVar247 = 0.0;
          fVar249 = 0.0;
          fVar266 = 0.0;
          fVar272 = 0.0;
          fVar268 = 0.0;
          fVar271 = 0.0;
          fVar304 = 0.0;
          fVar328 = 0.0;
          fVar330 = 0.0;
          _local_598 = ZEXT816(0);
          iVar132 = 0;
          auVar370 = _DAT_01f45a30;
          auVar420 = _DAT_01f45a40;
        }
        else {
          auVar366 = sqrtps(local_108,auVar197);
          auVar172._0_4_ = auVar367._0_4_ + auVar367._0_4_;
          auVar172._4_4_ = auVar367._4_4_ + auVar367._4_4_;
          auVar172._8_4_ = auVar367._8_4_ + auVar367._8_4_;
          auVar172._12_4_ = auVar367._12_4_ + auVar367._12_4_;
          auVar232 = rcpps(auVar235,auVar172);
          fVar331 = auVar232._0_4_;
          fVar345 = auVar232._4_4_;
          fVar334 = auVar232._8_4_;
          fVar352 = auVar232._12_4_;
          fVar331 = ((float)DAT_01f46a60 - auVar172._0_4_ * fVar331) * fVar331 + fVar331;
          fVar345 = (DAT_01f46a60._4_4_ - auVar172._4_4_ * fVar345) * fVar345 + fVar345;
          fVar334 = (DAT_01f46a60._8_4_ - auVar172._8_4_ * fVar334) * fVar334 + fVar334;
          fVar352 = (DAT_01f46a60._12_4_ - auVar172._12_4_ * fVar352) * fVar352 + fVar352;
          local_2b8 = (float)uVar416;
          fStack_2b4 = (float)(uVar416 >> 0x20);
          fVar342 = (local_2b8 - auVar366._0_4_) * fVar331;
          fVar354 = (fStack_2b4 - auVar366._4_4_) * fVar345;
          fVar346 = (-fVar269 - auVar366._8_4_) * fVar334;
          fVar356 = (-fVar302 - auVar366._12_4_) * fVar352;
          fVar331 = (auVar366._0_4_ - fVar266) * fVar331;
          fVar345 = (auVar366._4_4_ - fVar268) * fVar345;
          fVar334 = (auVar366._8_4_ - fVar269) * fVar334;
          fVar352 = (auVar366._12_4_ - fVar302) * fVar352;
          fVar299 = (fVar423 * fVar342 + fVar404) * fVar447;
          fVar269 = (fVar394 * fVar354 + fVar410) * fVar455;
          fVar301 = (fVar398 * fVar346 + fVar412) * fVar217;
          fVar302 = (fVar402 * fVar356 + fVar414) * fVar247;
          fVar249 = local_578 * fVar342 - (auVar458._0_4_ * fVar299 + local_568);
          fVar266 = fStack_574 * fVar354 - (auVar458._4_4_ * fVar269 + fStack_564);
          fVar272 = fStack_570 * fVar346 - (auVar458._8_4_ * fVar301 + fStack_560);
          fVar268 = fStack_56c * fVar356 - (auVar458._12_4_ * fVar302 + fStack_55c);
          fVar271 = fVar248 * fVar342 - (fVar403 * fVar299 + local_558);
          fVar304 = fVar248 * fVar354 - (fVar409 * fVar269 + fStack_554);
          fVar328 = fVar248 * fVar346 - (fVar411 * fVar301 + fStack_550);
          fVar330 = fVar248 * fVar356 - (fVar413 * fVar302 + fStack_54c);
          local_598._4_4_ = fVar265 * fVar354 - (fVar269 * fVar424 + fVar435);
          local_598._0_4_ = fVar265 * fVar342 - (fVar299 * fVar422 + fVar425);
          fStack_590 = fVar265 * fVar346 - (fVar301 * fVar397 + fVar437);
          fStack_58c = fVar265 * fVar356 - (fVar302 * fVar401 + fVar439);
          fVar447 = (fVar423 * fVar331 + fVar404) * fVar447;
          fVar455 = (fVar394 * fVar345 + fVar410) * fVar455;
          fVar217 = (fVar398 * fVar334 + fVar412) * fVar217;
          fVar247 = (fVar402 * fVar352 + fVar414) * fVar247;
          local_648._4_4_ = fStack_574 * fVar345 - (auVar458._4_4_ * fVar455 + fStack_564);
          local_648._0_4_ = local_578 * fVar331 - (auVar458._0_4_ * fVar447 + local_568);
          fStack_640 = fStack_570 * fVar334 - (auVar458._8_4_ * fVar217 + fStack_560);
          fStack_63c = fStack_56c * fVar352 - (auVar458._12_4_ * fVar247 + fStack_55c);
          fVar299 = fVar248 * fVar331 - (fVar403 * fVar447 + local_558);
          fVar269 = fVar248 * fVar345 - (fVar409 * fVar455 + fStack_554);
          fVar301 = fVar248 * fVar334 - (fVar411 * fVar217 + fStack_550);
          fVar302 = fVar248 * fVar352 - (fVar413 * fVar247 + fStack_54c);
          bVar122 = 0.0 <= auVar197._0_4_;
          uVar124 = -(uint)bVar122;
          bVar31 = 0.0 <= auVar197._4_4_;
          uVar126 = -(uint)bVar31;
          bVar32 = 0.0 <= auVar197._8_4_;
          uVar128 = -(uint)bVar32;
          bVar33 = 0.0 <= auVar197._12_4_;
          uVar130 = -(uint)bVar33;
          fVar447 = fVar265 * fVar331 - (fVar447 * fVar422 + fVar425);
          fVar455 = fVar265 * fVar345 - (fVar455 * fVar424 + fVar435);
          fVar217 = fVar265 * fVar334 - (fVar217 * fVar397 + fVar437);
          fVar247 = fVar265 * fVar352 - (fVar247 * fVar401 + fVar439);
          auVar289._0_4_ = (uint)fVar342 & uVar124;
          auVar289._4_4_ = (uint)fVar354 & uVar126;
          auVar289._8_4_ = (uint)fVar346 & uVar128;
          auVar289._12_4_ = (uint)fVar356 & uVar130;
          auVar370._0_8_ = CONCAT44(~uVar126,~uVar124) & 0x7f8000007f800000;
          auVar370._8_4_ = ~uVar128 & 0x7f800000;
          auVar370._12_4_ = ~uVar130 & 0x7f800000;
          auVar370 = auVar370 | auVar289;
          auVar349._0_4_ = (uint)fVar331 & uVar124;
          auVar349._4_4_ = (uint)fVar345 & uVar126;
          auVar349._8_4_ = (uint)fVar334 & uVar128;
          auVar349._12_4_ = (uint)fVar352 & uVar130;
          auVar420._0_8_ = CONCAT44(~uVar126,~uVar124) & 0xff800000ff800000;
          auVar420._8_4_ = ~uVar128 & 0xff800000;
          auVar420._12_4_ = ~uVar130 & 0xff800000;
          auVar420 = auVar420 | auVar349;
          auVar79._4_4_ = fVar327;
          auVar79._0_4_ = fVar303;
          auVar79._8_4_ = fVar332;
          auVar79._12_4_ = fVar339;
          auVar232 = maxps(auVar79,auVar166);
          fVar331 = auVar232._0_4_ * 1.9073486e-06;
          fVar345 = auVar232._4_4_ * 1.9073486e-06;
          fVar334 = auVar232._8_4_ * 1.9073486e-06;
          fVar352 = auVar232._12_4_ * 1.9073486e-06;
          local_288 = (float)(uVar120 & 0x7fffffff7fffffff);
          fStack_284 = (float)((uVar120 & 0x7fffffff7fffffff) >> 0x20);
          auVar290._0_4_ = -(uint)(local_288 < fVar331 && bVar122);
          auVar290._4_4_ = -(uint)(fStack_284 < fVar345 && bVar31);
          auVar290._8_4_ = -(uint)(fVar396 < fVar334 && bVar32);
          auVar290._12_4_ = -(uint)(fVar415 < fVar352 && bVar33);
          iVar132 = movmskps(iVar132,auVar290);
          if (iVar132 != 0) {
            uVar124 = -(uint)(fVar445 <= 0.0);
            uVar126 = -(uint)(fVar449 <= 0.0);
            uVar128 = -(uint)(fVar457 <= 0.0);
            uVar130 = -(uint)(fVar246 <= 0.0);
            auVar390._0_4_ = (uVar124 & 0xff800000 | ~uVar124 & 0x7f800000) & auVar290._0_4_;
            auVar390._4_4_ = (uVar126 & 0xff800000 | ~uVar126 & 0x7f800000) & auVar290._4_4_;
            auVar390._8_4_ = (uVar128 & 0xff800000 | ~uVar128 & 0x7f800000) & auVar290._8_4_;
            auVar390._12_4_ = (uVar130 & 0xff800000 | ~uVar130 & 0x7f800000) & auVar290._12_4_;
            auVar407._0_4_ = ~auVar290._0_4_ & auVar370._0_4_;
            auVar407._4_4_ = ~auVar290._4_4_ & auVar370._4_4_;
            auVar407._8_4_ = ~auVar290._8_4_ & auVar370._8_4_;
            auVar407._12_4_ = ~auVar290._12_4_ & auVar370._12_4_;
            auVar373._0_4_ = (uVar124 & 0x7f800000 | ~uVar124 & 0xff800000) & auVar290._0_4_;
            auVar373._4_4_ = (uVar126 & 0x7f800000 | ~uVar126 & 0xff800000) & auVar290._4_4_;
            auVar373._8_4_ = (uVar128 & 0x7f800000 | ~uVar128 & 0xff800000) & auVar290._8_4_;
            auVar373._12_4_ = (uVar130 & 0x7f800000 | ~uVar130 & 0xff800000) & auVar290._12_4_;
            auVar297._0_4_ = ~auVar290._0_4_ & auVar420._0_4_;
            auVar297._4_4_ = ~auVar290._4_4_ & auVar420._4_4_;
            auVar297._8_4_ = ~auVar290._8_4_ & auVar420._8_4_;
            auVar297._12_4_ = ~auVar290._12_4_ & auVar420._12_4_;
            auVar454._4_4_ = -(uint)((fVar345 <= fStack_284 || fVar449 <= 0.0) && bVar31);
            auVar454._0_4_ = -(uint)((fVar331 <= local_288 || fVar445 <= 0.0) && bVar122);
            auVar454._8_4_ = -(uint)((fVar334 <= fVar396 || fVar457 <= 0.0) && bVar32);
            auVar454._12_4_ = -(uint)((fVar352 <= fVar415 || fVar246 <= 0.0) && bVar33);
            auVar370 = auVar407 | auVar390;
            auVar420 = auVar297 | auVar373;
          }
        }
        fVar445 = (float)local_648._0_4_ * local_578;
        fVar449 = (float)local_648._4_4_ * fStack_574;
        fStack_640 = fStack_640 * fStack_570;
        fStack_63c = fStack_63c * fStack_56c;
        auVar232 = minps((undefined1  [16])aVar432,auVar370);
        aVar371 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar308,auVar420);
        tp1.lower.field_0 = aVar371;
        tp1.upper.field_0 = aVar432;
        auVar350._0_8_ =
             CONCAT44(-(uint)(fVar456 <= auVar232._4_4_) & auVar462._4_4_,
                      -(uint)(fVar442 <= auVar232._0_4_) & auVar462._0_4_);
        auVar350._8_4_ = -(uint)(fVar244 <= auVar232._8_4_) & auVar462._8_4_;
        auVar350._12_4_ = -(uint)(fVar448 <= auVar232._12_4_) & auVar462._12_4_;
        uVar124 = -(uint)(aVar371.v[0] <= aVar432.v[0]) & auVar462._0_4_;
        uVar126 = -(uint)(aVar371.v[1] <= aVar432.v[1]) & auVar462._4_4_;
        auVar173._4_4_ = uVar126;
        auVar173._0_4_ = uVar124;
        uVar128 = -(uint)(aVar371.v[2] <= aVar432.v[2]) & auVar462._8_4_;
        uVar130 = -(uint)(aVar371.v[3] <= aVar432.v[3]) & auVar462._12_4_;
        auVar173._8_4_ = uVar128;
        auVar173._12_4_ = uVar130;
        iVar132 = movmskps(iVar132,auVar173 | auVar350);
        lVar114 = CONCAT44((int)((ulong)pSVar112 >> 0x20),iVar132);
        if (iVar132 != 0) {
          local_598._0_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_598._0_4_ * fVar265 +
                                                 fVar271 * fVar248 + fVar249 * local_578)) &
                             auVar454._0_4_) << 0x1f) >> 0x1f) + 4);
          local_598._4_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_598._4_4_ * fVar265 +
                                                 fVar304 * fVar248 + fVar266 * fStack_574)) &
                             auVar454._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_590 = (float)-(uint)((int)uVar118 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_590 * fVar265 +
                                                                fVar328 * fVar248 +
                                                                fVar272 * fStack_570)) &
                                            auVar454._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_58c = (float)-(uint)((int)uVar118 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_58c * fVar265 +
                                                                fVar330 * fVar248 +
                                                                fVar268 * fStack_56c)) &
                                            auVar454._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar174 = ~_local_598 & auVar350;
          fVar457 = local_588 + fVar442;
          fVar246 = fStack_584 + fVar456;
          fVar249 = fStack_580 + fVar244;
          fVar266 = fStack_57c + fVar448;
          auVar291._8_4_ = auVar350._8_4_;
          auVar291._0_8_ = auVar350._0_8_;
          auVar291._12_4_ = auVar350._12_4_;
          auVar372._4_4_ = fVar215;
          auVar372._0_4_ = fVar351;
          auVar372._8_4_ = fVar329;
          auVar372._12_4_ = fVar446;
          while( true ) {
            vVar107.field_0 = tp1.lower.field_0;
            uStack_544._2_2_ = (undefined2)((uint)fVar444 >> 0x10);
            uStack_544._0_2_ = SUB42(fVar444,0);
            local_398 = auVar174;
            uVar110 = (undefined4)((ulong)lVar114 >> 0x20);
            iVar132 = movmskps((int)lVar114,auVar174);
            lVar114 = CONCAT44(uVar110,iVar132);
            if (iVar132 == 0) break;
            auVar366 = ~auVar174 & _DAT_01f45a30 | auVar174 & auVar308;
            auVar257._4_4_ = auVar366._0_4_;
            auVar257._0_4_ = auVar366._4_4_;
            auVar257._8_4_ = auVar366._12_4_;
            auVar257._12_4_ = auVar366._8_4_;
            auVar232 = minps(auVar257,auVar366);
            auVar198._0_8_ = auVar232._8_8_;
            auVar198._8_4_ = auVar232._0_4_;
            auVar198._12_4_ = auVar232._4_4_;
            auVar232 = minps(auVar198,auVar232);
            auVar199._0_8_ =
                 CONCAT44(-(uint)(auVar232._4_4_ == auVar366._4_4_) & auVar174._4_4_,
                          -(uint)(auVar232._0_4_ == auVar366._0_4_) & auVar174._0_4_);
            auVar199._8_4_ = -(uint)(auVar232._8_4_ == auVar366._8_4_) & auVar174._8_4_;
            auVar199._12_4_ = -(uint)(auVar232._12_4_ == auVar366._12_4_) & auVar174._12_4_;
            iVar132 = movmskps(iVar132,auVar199);
            if (iVar132 != 0) {
              auVar174._8_4_ = auVar199._8_4_;
              auVar174._0_8_ = auVar199._0_8_;
              auVar174._12_4_ = auVar199._12_4_;
            }
            uVar108 = movmskps(iVar132,auVar174);
            uVar120 = CONCAT44(uVar110,uVar108);
            lVar114 = 0;
            if (uVar120 != 0) {
              for (; (uVar120 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
              }
            }
            *(undefined4 *)(local_398 + lVar114 * 4) = 0;
            auVar74._4_2_ = uStack_5f4;
            auVar74._0_4_ = fVar358;
            auVar74._6_2_ = uStack_5f2;
            auVar74._8_4_ = fVar376;
            auVar74._12_4_ = fVar379;
            auVar366 = minps(auVar372,auVar74);
            auVar419 = maxps(auVar372,auVar74);
            auVar76._4_2_ = (undefined2)uStack_544;
            auVar76._0_4_ = fVar441;
            auVar76._6_2_ = uStack_544._2_2_;
            auVar76._8_4_ = fStack_540;
            auVar76._12_4_ = fStack_53c;
            auVar232 = minps(auVar76,_local_5e8);
            auVar366 = minps(auVar366,auVar232);
            auVar232 = maxps(auVar76,_local_5e8);
            auVar419 = maxps(auVar419,auVar232);
            auVar236._0_8_ = auVar366._0_8_ & 0x7fffffff7fffffff;
            auVar236._8_4_ = auVar366._8_4_ & 0x7fffffff;
            auVar236._12_4_ = auVar366._12_4_ & 0x7fffffff;
            auVar175._0_8_ = auVar419._0_8_ & 0x7fffffff7fffffff;
            auVar175._8_4_ = auVar419._8_4_ & 0x7fffffff;
            auVar175._12_4_ = ABS(auVar419._12_4_);
            auVar232 = maxps(auVar236,auVar175);
            fVar272 = auVar232._4_4_;
            if (auVar232._4_4_ <= auVar232._0_4_) {
              fVar272 = auVar232._0_4_;
            }
            auVar237._8_8_ = auVar232._8_8_;
            auVar237._0_8_ = auVar232._8_8_;
            if (auVar232._8_4_ <= fVar272) {
              auVar237._0_4_ = fVar272;
            }
            fVar271 = auVar237._0_4_ * 1.9073486e-06;
            fVar272 = *(float *)(local_108 + lVar114 * 4);
            fVar268 = local_118[lVar114 + -8];
            fVar304 = 0.0;
            fVar328 = 0.0;
            for (uVar120 = 0; uVar120 != 5; uVar120 = uVar120 + 1) {
              fVar345 = SQRT(fVar298) * 1.9073486e-06 * fVar268;
              fVar354 = 1.0 - fVar272;
              fVar331 = fVar358 * fVar354 + fVar441 * fVar272;
              fVar340 = fVar374 * fVar354 + fVar444 * fVar272;
              fVar344 = fVar376 * fVar354 + fStack_540 * fVar272;
              fVar346 = fVar379 * fVar354 + fStack_53c * fVar272;
              fVar334 = (auVar372._0_4_ * fVar354 + fVar358 * fVar272) * fVar354 + fVar272 * fVar331
              ;
              fVar352 = (auVar372._4_4_ * fVar354 + fVar374 * fVar272) * fVar354 + fVar272 * fVar340
              ;
              fVar342 = (auVar372._8_4_ * fVar354 + fVar376 * fVar272) * fVar354 + fVar272 * fVar344
              ;
              fVar330 = (auVar372._12_4_ * fVar354 + fVar379 * fVar272) * fVar354 +
                        fVar272 * fVar346;
              fVar355 = fVar331 * fVar354 +
                        (fVar441 * fVar354 + (float)local_5e8._0_4_ * fVar272) * fVar272;
              fVar357 = fVar340 * fVar354 +
                        (fVar444 * fVar354 + (float)local_5e8._4_4_ * fVar272) * fVar272;
              fVar359 = fVar344 * fVar354 + (fStack_540 * fVar354 + fStack_5e0 * fVar272) * fVar272;
              fVar340 = fVar346 * fVar354 + (fStack_53c * fVar354 + fStack_5dc * fVar272) * fVar272;
              fVar331 = fVar354 * fVar330 + fVar272 * fVar340;
              local_568 = (fVar355 - fVar334) * 3.0;
              fStack_564 = (fVar357 - fVar352) * 3.0;
              fStack_560 = (fVar359 - fVar342) * 3.0;
              fStack_55c = (fVar340 - fVar330) * 3.0;
              fVar346 = fVar354 * 6.0;
              fVar340 = (fVar272 - (fVar354 + fVar354)) * 6.0;
              fVar344 = (fVar354 - (fVar272 + fVar272)) * 6.0;
              fVar330 = fVar272 * 6.0;
              fVar353 = fVar346 * auVar372._0_4_ +
                        fVar340 * fVar358 + fVar344 * fVar441 + fVar330 * (float)local_5e8._0_4_;
              fVar356 = fVar346 * auVar372._4_4_ +
                        fVar340 * fVar374 + fVar344 * fVar444 + fVar330 * (float)local_5e8._4_4_;
              fVar344 = fVar346 * auVar372._8_4_ +
                        fVar340 * fVar376 + fVar344 * fStack_540 + fVar330 * fStack_5e0;
              fVar334 = (fVar268 * fVar243 + 0.0) - (fVar354 * fVar334 + fVar272 * fVar355);
              fVar340 = (fVar268 * fVar248 + 0.0) - (fVar354 * fVar352 + fVar272 * fVar357);
              fVar352 = (fVar268 * fVar265 + 0.0) - (fVar354 * fVar342 + fVar272 * fVar359);
              fVar342 = (fVar268 * 0.0 + 0.0) - fVar331;
              fVar330 = fVar340 * fVar340;
              fStack_5b0 = fVar352 * fVar352;
              fStack_5ac = fVar342 * fVar342;
              local_5b8._0_4_ = fVar330 + fVar334 * fVar334 + fStack_5b0;
              local_5b8._4_4_ = fVar330 + fVar330 + fStack_5ac;
              fStack_5b0 = fVar330 + fStack_5b0 + fStack_5b0;
              fStack_5ac = fVar330 + fStack_5ac + fStack_5ac;
              fVar330 = fVar271;
              if (fVar271 <= fVar345) {
                fVar330 = fVar345;
              }
              fVar400 = -local_568;
              fVar415 = -fStack_564;
              fVar422 = -fStack_560;
              fVar354 = fStack_564 * fStack_564 + local_568 * local_568 + fStack_560 * fStack_560;
              auVar232 = ZEXT416((uint)fVar354);
              auVar366 = rsqrtss(ZEXT416((uint)fVar354),auVar232);
              fVar345 = auVar366._0_4_;
              fVar346 = fVar345 * 1.5 - fVar345 * fVar345 * fVar354 * 0.5 * fVar345;
              fVar423 = local_568 * fVar346;
              fVar424 = fStack_564 * fVar346;
              fVar394 = fStack_560 * fVar346;
              fVar397 = fStack_55c * fVar346;
              fVar380 = fStack_560 * fVar344 + fStack_564 * fVar356 + local_568 * fVar353;
              auVar232 = rcpss(auVar232,auVar232);
              fVar345 = (2.0 - fVar354 * auVar232._0_4_) * auVar232._0_4_;
              fVar355 = fVar340 * fVar424;
              fVar357 = fVar352 * fVar394;
              fVar359 = fVar342 * fVar397;
              fVar393 = fVar355 + fVar334 * fVar423 + fVar357;
              fVar396 = fVar355 + fVar355 + fVar359;
              fVar357 = fVar355 + fVar357 + fVar357;
              fVar359 = fVar355 + fVar359 + fVar359;
              fVar355 = (SQRT((float)local_5b8._0_4_) + 1.0) * (fVar271 / SQRT(fVar354)) +
                        SQRT((float)local_5b8._0_4_) * fVar271 + fVar330;
              fVar398 = fVar397 * -fStack_55c;
              fVar346 = fVar394 * fVar422 + fVar424 * fVar415 + fVar423 * fVar400 +
                        fVar345 * (fVar354 * fVar344 - fVar380 * fStack_560) * fVar346 * fVar352 +
                        fVar345 * (fVar354 * fVar356 - fVar380 * fStack_564) * fVar346 * fVar340 +
                        fVar345 * (fVar354 * fVar353 - fVar380 * local_568) * fVar346 * fVar334;
              fVar353 = fVar265 * fVar394 + fVar248 * fVar424 + fVar243 * fVar423;
              fVar345 = (float)local_5b8._0_4_ - fVar393 * fVar393;
              auVar176._0_8_ = CONCAT44((float)local_5b8._4_4_ - fVar396 * fVar396,fVar345);
              auVar176._8_4_ = fStack_5b0 - fVar357 * fVar357;
              auVar176._12_4_ = fStack_5ac - fVar359 * fVar359;
              fVar354 = -fStack_55c * fVar342;
              auVar200._8_4_ = auVar176._8_4_;
              auVar200._0_8_ = auVar176._0_8_;
              auVar200._12_4_ = auVar176._12_4_;
              auVar232 = rsqrtss(auVar200,auVar176);
              fVar344 = auVar232._0_4_;
              fVar344 = fVar344 * 1.5 - fVar344 * fVar344 * fVar345 * 0.5 * fVar344;
              local_558 = fVar268;
              fStack_554 = fVar272;
              fStack_550 = fVar304;
              fStack_54c = fVar328;
              if (fVar345 < 0.0) {
                local_548 = fVar441;
                uStack_544 = fVar444;
                fVar345 = sqrtf(fVar345);
                lVar114 = extraout_RAX;
                uVar117 = extraout_RDX;
                fVar441 = local_548;
                fVar444 = uStack_544;
              }
              else {
                fVar345 = SQRT(fVar345);
              }
              fVar345 = fVar345 - fVar331;
              fVar272 = ((fVar422 * fVar352 + fVar415 * fVar340 + fVar400 * fVar334) -
                        fVar393 * fVar346) * fVar344 - fStack_55c;
              fVar344 = ((fVar265 * fVar352 + fVar248 * fVar340 + fVar243 * fVar334) -
                        fVar393 * fVar353) * fVar344;
              auVar322._4_4_ = fVar398;
              auVar322._0_4_ = fVar346;
              auVar258._0_4_ = fVar346 * fVar344 - fVar353 * fVar272;
              auVar293._8_4_ = -fVar354;
              auVar293._0_8_ = CONCAT44(fVar354,fVar272) ^ 0x8000000000000000;
              auVar293._12_4_ = fVar342 * 0.0;
              auVar292._8_8_ = auVar293._8_8_;
              auVar292._0_8_ = CONCAT44(fVar344,fVar272) ^ 0x80000000;
              auVar258._4_4_ = auVar258._0_4_;
              auVar258._8_4_ = auVar258._0_4_;
              auVar258._12_4_ = auVar258._0_4_;
              auVar232 = divps(auVar292,auVar258);
              auVar322._8_4_ = fVar398;
              auVar322._12_4_ = -(fVar397 * 0.0);
              auVar321._8_8_ = auVar322._8_8_;
              auVar321._0_8_ = CONCAT44(fVar353,fVar346) ^ 0x8000000000000000;
              auVar366 = divps(auVar321,auVar258);
              fVar268 = local_558 - (fVar345 * auVar366._0_4_ + fVar393 * auVar232._0_4_);
              fVar272 = fStack_554 - (fVar345 * auVar366._4_4_ + fVar393 * auVar232._4_4_);
              fVar304 = fStack_550 - (fVar345 * auVar366._8_4_ + fVar393 * auVar232._8_4_);
              fVar328 = fStack_54c - (fVar345 * auVar366._12_4_ + fVar393 * auVar232._12_4_);
              if ((ABS(fVar393) < fVar355) &&
                 (ABS(fVar345) < auVar419._12_4_ * 1.9073486e-06 + fVar330 + fVar355)) {
                bVar122 = uVar120 < 5;
                fVar268 = fVar341 + fVar268;
                if (fVar268 < fVar245) {
                  lVar114 = 0;
                }
                else {
                  fVar271 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar271 < fVar268) {
                    lVar114 = 0;
                  }
                  else {
                    lVar114 = 0;
                    if ((0.0 <= fVar272) && (fVar272 <= 1.0)) {
                      auVar232 = rsqrtss(_local_5b8,_local_5b8);
                      fVar304 = auVar232._0_4_;
                      pGVar26 = (context->scene->geometries).items[uVar119].ptr;
                      if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        lVar114 = 0;
                        pRVar115 = (RTCIntersectArguments *)context;
                        uVar117 = uVar119;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (lVar114 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pRVar115 = (RTCIntersectArguments *)context, uVar117 = uVar119,
                              pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar304 = fVar304 * 1.5 +
                                  fVar304 * fVar304 * (float)local_5b8._0_4_ * -0.5 * fVar304;
                        fVar334 = fVar334 * fVar304;
                        fVar340 = fVar340 * fVar304;
                        fVar352 = fVar352 * fVar304;
                        fVar304 = fStack_55c * fVar334 + local_568;
                        fVar328 = fStack_55c * fVar340 + fStack_564;
                        fVar330 = fStack_55c * fVar352 + fStack_560;
                        fVar331 = fVar340 * local_568 - fStack_564 * fVar334;
                        fVar345 = fVar352 * fStack_564 - fStack_560 * fVar340;
                        fVar334 = fVar334 * fStack_560 - local_568 * fVar352;
                        local_368 = fVar345 * fVar328 - fVar334 * fVar304;
                        local_388._4_4_ = fVar334 * fVar330 - fVar331 * fVar328;
                        local_378 = fVar331 * fVar304 - fVar345 * fVar330;
                        local_388._0_4_ = local_388._4_4_;
                        fStack_380 = (float)local_388._4_4_;
                        fStack_37c = (float)local_388._4_4_;
                        fStack_374 = local_378;
                        fStack_370 = local_378;
                        fStack_36c = local_378;
                        fStack_364 = local_368;
                        fStack_360 = local_368;
                        fStack_35c = local_368;
                        local_358 = fVar272;
                        fStack_354 = fVar272;
                        fStack_350 = fVar272;
                        fStack_34c = fVar272;
                        local_348 = 0;
                        uStack_344 = 0;
                        uStack_340 = 0;
                        uStack_33c = 0;
                        local_338 = CONCAT44(uVar127,uVar127);
                        uStack_330 = CONCAT44(uVar127,uVar127);
                        local_328 = CONCAT44(uVar125,uVar125);
                        uStack_320 = CONCAT44(uVar125,uVar125);
                        local_318 = context->user->instID[0];
                        uStack_314 = local_318;
                        uStack_310 = local_318;
                        uStack_30c = local_318;
                        local_308 = context->user->instPrimID[0];
                        uStack_304 = local_308;
                        uStack_300 = local_308;
                        uStack_2fc = local_308;
                        *(float *)(ray + k * 4 + 0x80) = fVar268;
                        local_5a8 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        args.valid = (int *)local_5a8;
                        args.geometryUserPtr = pGVar26->userPtr;
                        args.context = context->user;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)local_388;
                        args.N = 4;
                        p_Var30 = pGVar26->occlusionFilterN;
                        auVar463._8_8_ = &local_318;
                        auVar463._0_8_ = p_Var30;
                        pRVar115 = (RTCIntersectArguments *)context;
                        local_548 = fVar441;
                        uStack_544 = fVar444;
                        if (p_Var30 != (RTCFilterFunctionN)0x0) {
                          auVar463 = (*p_Var30)(&args);
                        }
                        uVar117 = auVar463._8_8_;
                        auVar201._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                        auVar201._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                        auVar201._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                        auVar201._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                        uVar109 = movmskps(auVar463._0_4_,auVar201);
                        pRVar113 = (RTCRayN *)(ulong)(uVar109 ^ 0xf);
                        if ((uVar109 ^ 0xf) == 0) {
                          auVar201 = auVar201 ^ _DAT_01f46b70;
                          fVar441 = local_548;
                          fVar444 = uStack_544;
                        }
                        else {
                          pRVar115 = context->args;
                          if ((RTCIntersectArguments *)pRVar115->filter ==
                              (RTCIntersectArguments *)0x0) {
                          }
                          else if ((((ulong)*(Scene **)&pRVar115->flags & 2) != 0) ||
                                  (((pGVar26->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)pRVar115->filter)(&args);
                            uVar117 = extraout_RDX_00;
                          }
                          auVar177._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                          auVar177._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                          auVar177._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                          auVar177._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                          auVar201 = auVar177 ^ _DAT_01f46b70;
                          *(undefined1 (*) [16])(args.ray + 0x80) =
                               ~auVar177 & _DAT_01f45a40 |
                               *(undefined1 (*) [16])(args.ray + 0x80) & auVar177;
                          pRVar113 = args.ray;
                          fVar441 = local_548;
                          fVar444 = uStack_544;
                        }
                        auVar202._0_4_ = auVar201._0_4_ << 0x1f;
                        auVar202._4_4_ = auVar201._4_4_ << 0x1f;
                        auVar202._8_4_ = auVar201._8_4_ << 0x1f;
                        auVar202._12_4_ = auVar201._12_4_ << 0x1f;
                        iVar132 = movmskps((int)pRVar113,auVar202);
                        lVar114 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar113 >> 0x20),iVar132)
                                                 >> 8),iVar132 != 0);
                        if (iVar132 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar271;
                        }
                      }
                    }
                  }
                }
                goto LAB_0035f38c;
              }
            }
            bVar122 = false;
LAB_0035f38c:
            bVar121 = bVar121 | bVar122 & (byte)lVar114;
            fVar426 = *(float *)(ray + k * 4 + 0x80);
            auVar174._0_4_ = -(uint)(fVar457 <= fVar426) & local_398._0_4_;
            auVar174._4_4_ = -(uint)(fVar246 <= fVar426) & local_398._4_4_;
            auVar174._8_4_ = -(uint)(fVar249 <= fVar426) & local_398._8_4_;
            auVar174._12_4_ = -(uint)(fVar266 <= fVar426) & local_398._12_4_;
            auVar291 = auVar350;
          }
          auVar238._0_4_ = -(uint)(aVar371.v[0] + local_588 <= fVar426) & uVar124;
          auVar238._4_4_ = -(uint)(aVar371.v[1] + fStack_584 <= fVar426) & uVar126;
          auVar238._8_4_ = -(uint)(aVar371.v[2] + fStack_580 <= fVar426) & uVar128;
          auVar238._12_4_ = -(uint)(aVar371.v[3] + fStack_57c <= fVar426) & uVar130;
          auVar178._0_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS(fVar445 + fVar299 * fVar248 + fVar447 * fVar265)) &
                             auVar454._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar178._4_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS(fVar449 + fVar269 * fVar248 + fVar455 * fVar265)) &
                             auVar454._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar178._8_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_640 + fVar301 * fVar248 + fVar217 * fVar265)
                                     ) & auVar454._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar178._12_4_ =
               -(uint)((int)uVar118 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_63c + fVar302 * fVar248 + fVar247 * fVar265)
                                     ) & auVar454._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar179 = ~auVar178 & auVar238;
          fVar445 = local_588 + tp1.lower.field_0.v[0];
          fVar447 = fStack_584 + tp1.lower.field_0.v[1];
          fVar449 = fStack_580 + tp1.lower.field_0.v[2];
          fVar455 = fStack_57c + tp1.lower.field_0.v[3];
          while( true ) {
            uStack_544._2_2_ = (undefined2)((uint)fVar444 >> 0x10);
            uStack_544._0_2_ = SUB42(fVar444,0);
            local_3a8 = auVar179;
            iVar132 = movmskps((int)lVar114,auVar179);
            if (iVar132 == 0) break;
            auVar232 = ~auVar179 & _DAT_01f45a30 | auVar179 & (undefined1  [16])vVar107.field_0;
            auVar259._4_4_ = auVar232._0_4_;
            auVar259._0_4_ = auVar232._4_4_;
            auVar259._8_4_ = auVar232._12_4_;
            auVar259._12_4_ = auVar232._8_4_;
            auVar308 = minps(auVar259,auVar232);
            auVar203._0_8_ = auVar308._8_8_;
            auVar203._8_4_ = auVar308._0_4_;
            auVar203._12_4_ = auVar308._4_4_;
            auVar308 = minps(auVar203,auVar308);
            auVar204._0_8_ =
                 CONCAT44(-(uint)(auVar308._4_4_ == auVar232._4_4_) & auVar179._4_4_,
                          -(uint)(auVar308._0_4_ == auVar232._0_4_) & auVar179._0_4_);
            auVar204._8_4_ = -(uint)(auVar308._8_4_ == auVar232._8_4_) & auVar179._8_4_;
            auVar204._12_4_ = -(uint)(auVar308._12_4_ == auVar232._12_4_) & auVar179._12_4_;
            iVar132 = movmskps(iVar132,auVar204);
            if (iVar132 != 0) {
              auVar179._8_4_ = auVar204._8_4_;
              auVar179._0_8_ = auVar204._0_8_;
              auVar179._12_4_ = auVar204._12_4_;
            }
            uVar110 = movmskps(iVar132,auVar179);
            uVar120 = CONCAT44((int)((ulong)lVar114 >> 0x20),uVar110);
            lVar114 = 0;
            if (uVar120 != 0) {
              for (; (uVar120 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
              }
            }
            *(undefined4 *)(local_3a8 + lVar114 * 4) = 0;
            auVar75._4_2_ = uStack_5f4;
            auVar75._0_4_ = fVar358;
            auVar75._6_2_ = uStack_5f2;
            auVar75._8_4_ = fVar376;
            auVar75._12_4_ = fVar379;
            auVar232 = minps(auVar372,auVar75);
            auVar366 = maxps(auVar372,auVar75);
            auVar77._4_2_ = (undefined2)uStack_544;
            auVar77._0_4_ = fVar441;
            auVar77._6_2_ = uStack_544._2_2_;
            auVar77._8_4_ = fStack_540;
            auVar77._12_4_ = fStack_53c;
            auVar308 = minps(auVar77,_local_5e8);
            auVar232 = minps(auVar232,auVar308);
            auVar308 = maxps(auVar77,_local_5e8);
            auVar366 = maxps(auVar366,auVar308);
            auVar239._0_8_ = auVar232._0_8_ & 0x7fffffff7fffffff;
            auVar239._8_4_ = auVar232._8_4_ & 0x7fffffff;
            auVar239._12_4_ = auVar232._12_4_ & 0x7fffffff;
            auVar180._0_8_ = auVar366._0_8_ & 0x7fffffff7fffffff;
            auVar180._8_4_ = auVar366._8_4_ & 0x7fffffff;
            auVar180._12_4_ = ABS(auVar366._12_4_);
            auVar308 = maxps(auVar239,auVar180);
            fVar457 = auVar308._4_4_;
            if (auVar308._4_4_ <= auVar308._0_4_) {
              fVar457 = auVar308._0_4_;
            }
            auVar240._8_8_ = auVar308._8_8_;
            auVar240._0_8_ = auVar308._8_8_;
            if (auVar308._8_4_ <= fVar457) {
              auVar240._0_4_ = fVar457;
            }
            fVar246 = auVar240._0_4_ * 1.9073486e-06;
            fVar457 = local_118[lVar114];
            fVar217 = tp1.upper.field_0.v[lVar114];
            for (uVar120 = 0; uVar120 != 5; uVar120 = uVar120 + 1) {
              fVar268 = SQRT(fVar298) * 1.9073486e-06 * fVar217;
              fVar247 = 1.0 - fVar457;
              fVar269 = fVar358 * fVar247 + fVar441 * fVar457;
              fVar301 = fVar374 * fVar247 + fVar444 * fVar457;
              fVar302 = fVar376 * fVar247 + fStack_540 * fVar457;
              fVar271 = fVar379 * fVar247 + fStack_53c * fVar457;
              fVar249 = (auVar372._0_4_ * fVar247 + fVar358 * fVar457) * fVar247 + fVar457 * fVar269
              ;
              fVar266 = (auVar372._4_4_ * fVar247 + fVar374 * fVar457) * fVar247 + fVar457 * fVar301
              ;
              fVar272 = (auVar372._8_4_ * fVar247 + fVar376 * fVar457) * fVar247 + fVar457 * fVar302
              ;
              fVar299 = (auVar372._12_4_ * fVar247 + fVar379 * fVar457) * fVar247 +
                        fVar457 * fVar271;
              fVar269 = fVar269 * fVar247 +
                        (fVar441 * fVar247 + (float)local_5e8._0_4_ * fVar457) * fVar457;
              fVar301 = fVar301 * fVar247 +
                        (fVar444 * fVar247 + (float)local_5e8._4_4_ * fVar457) * fVar457;
              fVar302 = fVar302 * fVar247 + (fStack_540 * fVar247 + fStack_5e0 * fVar457) * fVar457;
              fVar271 = fVar271 * fVar247 + (fStack_53c * fVar247 + fStack_5dc * fVar457) * fVar457;
              local_568 = fVar247 * fVar249 + fVar457 * fVar269;
              fStack_564 = fVar247 * fVar266 + fVar457 * fVar301;
              fStack_560 = fVar247 * fVar272 + fVar457 * fVar302;
              fStack_55c = fVar247 * fVar299 + fVar457 * fVar271;
              local_558 = (fVar269 - fVar249) * 3.0;
              fStack_554 = (fVar301 - fVar266) * 3.0;
              fStack_550 = (fVar302 - fVar272) * 3.0;
              fStack_54c = (fVar271 - fVar299) * 3.0;
              fVar249 = fVar247 * 6.0;
              fVar299 = (fVar457 - (fVar247 + fVar247)) * 6.0;
              fVar269 = (fVar247 - (fVar457 + fVar457)) * 6.0;
              fVar247 = fVar457 * 6.0;
              fVar266 = fVar249 * auVar372._0_4_ +
                        fVar299 * fVar358 + fVar269 * fVar441 + fVar247 * (float)local_5e8._0_4_;
              fVar272 = fVar249 * auVar372._4_4_ +
                        fVar299 * fVar374 + fVar269 * fVar444 + fVar247 * (float)local_5e8._4_4_;
              fVar249 = fVar249 * auVar372._8_4_ +
                        fVar299 * fVar376 + fVar269 * fStack_540 + fVar247 * fStack_5e0;
              fVar299 = (fVar217 * fVar243 + 0.0) - local_568;
              fVar269 = (fVar217 * fVar248 + 0.0) - fStack_564;
              fVar301 = (fVar217 * fVar265 + 0.0) - fStack_560;
              fVar302 = (fVar217 * 0.0 + 0.0) - fStack_55c;
              fVar247 = fVar269 * fVar269;
              fStack_450 = fVar301 * fVar301;
              fStack_44c = fVar302 * fVar302;
              local_458._0_4_ = fVar247 + fVar299 * fVar299 + fStack_450;
              local_458._4_4_ = fVar247 + fVar247 + fStack_44c;
              fStack_450 = fVar247 + fStack_450 + fStack_450;
              fStack_44c = fVar247 + fStack_44c + fStack_44c;
              fVar247 = fVar246;
              if (fVar246 <= fVar268) {
                fVar247 = fVar268;
              }
              fVar334 = -local_558;
              fVar340 = -fStack_554;
              fVar352 = -fStack_550;
              fVar271 = fStack_554 * fStack_554 + local_558 * local_558 + fStack_550 * fStack_550;
              auVar308 = ZEXT416((uint)fVar271);
              auVar232 = rsqrtss(ZEXT416((uint)fVar271),auVar308);
              fVar268 = auVar232._0_4_;
              fVar304 = fVar268 * 1.5 - fVar268 * fVar268 * fVar271 * 0.5 * fVar268;
              fVar342 = local_558 * fVar304;
              fVar344 = fStack_554 * fVar304;
              fVar354 = fStack_550 * fVar304;
              fVar346 = fStack_54c * fVar304;
              fVar345 = fStack_550 * fVar249 + fStack_554 * fVar272 + local_558 * fVar266;
              auVar308 = rcpss(auVar308,auVar308);
              fVar268 = (2.0 - fVar271 * auVar308._0_4_) * auVar308._0_4_;
              fVar328 = fVar269 * fVar344;
              fVar330 = fVar301 * fVar354;
              fVar331 = fVar302 * fVar346;
              fVar356 = fVar328 + fVar299 * fVar342 + fVar330;
              fVar355 = fVar328 + fVar328 + fVar331;
              fVar330 = fVar328 + fVar330 + fVar330;
              fVar331 = fVar328 + fVar331 + fVar331;
              fVar328 = (SQRT((float)local_458._0_4_) + 1.0) * (fVar246 / SQRT(fVar271)) +
                        SQRT((float)local_458._0_4_) * fVar246 + fVar247;
              fVar353 = fVar346 * -fStack_54c;
              fVar271 = fVar354 * fVar352 + fVar344 * fVar340 + fVar342 * fVar334 +
                        fVar268 * (fVar271 * fVar249 - fVar345 * fStack_550) * fVar304 * fVar301 +
                        fVar268 * (fVar271 * fVar272 - fVar345 * fStack_554) * fVar304 * fVar269 +
                        fVar268 * (fVar271 * fVar266 - fVar345 * local_558) * fVar304 * fVar299;
              fVar268 = fVar265 * fVar354 + fVar248 * fVar344 + fVar243 * fVar342;
              fVar249 = (float)local_458._0_4_ - fVar356 * fVar356;
              auVar433._0_8_ = CONCAT44((float)local_458._4_4_ - fVar355 * fVar355,fVar249);
              auVar433._8_4_ = fStack_450 - fVar330 * fVar330;
              auVar433._12_4_ = fStack_44c - fVar331 * fVar331;
              fVar272 = -fStack_54c * fVar302;
              auVar205._8_4_ = auVar433._8_4_;
              auVar205._0_8_ = auVar433._0_8_;
              auVar205._12_4_ = auVar433._12_4_;
              auVar308 = rsqrtss(auVar205,auVar433);
              fVar266 = auVar308._0_4_;
              fVar266 = fVar266 * 1.5 - fVar266 * fVar266 * fVar249 * 0.5 * fVar266;
              if (fVar249 < 0.0) {
                local_548 = fVar441;
                uStack_544 = fVar444;
                fVar249 = sqrtf(fVar249);
                lVar114 = extraout_RAX_00;
                uVar117 = extraout_RDX_01;
                fVar441 = local_548;
                fVar444 = uStack_544;
              }
              else {
                fVar249 = SQRT(fVar249);
              }
              fVar249 = fVar249 - fStack_55c;
              fVar304 = ((fVar352 * fVar301 + fVar340 * fVar269 + fVar334 * fVar299) -
                        fVar356 * fVar271) * fVar266 - fStack_54c;
              fVar266 = ((fVar265 * fVar301 + fVar248 * fVar269 + fVar243 * fVar299) -
                        fVar356 * fVar268) * fVar266;
              auVar324._4_4_ = fVar353;
              auVar324._0_4_ = fVar271;
              auVar260._0_4_ = fVar271 * fVar266 - fVar268 * fVar304;
              auVar295._8_4_ = -fVar272;
              auVar295._0_8_ = CONCAT44(fVar272,fVar304) ^ 0x8000000000000000;
              auVar295._12_4_ = fVar302 * 0.0;
              auVar294._8_8_ = auVar295._8_8_;
              auVar294._0_8_ = CONCAT44(fVar266,fVar304) ^ 0x80000000;
              auVar260._4_4_ = auVar260._0_4_;
              auVar260._8_4_ = auVar260._0_4_;
              auVar260._12_4_ = auVar260._0_4_;
              auVar308 = divps(auVar294,auVar260);
              auVar324._8_4_ = fVar353;
              auVar324._12_4_ = -(fVar346 * 0.0);
              auVar323._8_8_ = auVar324._8_8_;
              auVar323._0_8_ = CONCAT44(fVar268,fVar271) ^ 0x8000000000000000;
              auVar232 = divps(auVar323,auVar260);
              fVar217 = fVar217 - (fVar249 * auVar232._0_4_ + fVar356 * auVar308._0_4_);
              fVar457 = fVar457 - (fVar249 * auVar232._4_4_ + fVar356 * auVar308._4_4_);
              if ((ABS(fVar356) < fVar328) &&
                 (ABS(fVar249) < auVar366._12_4_ * 1.9073486e-06 + fVar247 + fVar328)) {
                bVar122 = uVar120 < 5;
                fVar217 = fVar341 + fVar217;
                if (fVar217 < fVar245) {
                  lVar114 = 0;
                }
                else {
                  fVar246 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar246 < fVar217) {
                    lVar114 = 0;
                  }
                  else {
                    lVar114 = 0;
                    if ((0.0 <= fVar457) && (fVar457 <= 1.0)) {
                      auVar308 = rsqrtss(_local_458,_local_458);
                      fVar247 = auVar308._0_4_;
                      pGVar26 = (context->scene->geometries).items[uVar119].ptr;
                      if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        lVar114 = 0;
                        pRVar115 = (RTCIntersectArguments *)context;
                        uVar117 = uVar119;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (lVar114 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pRVar115 = (RTCIntersectArguments *)context, uVar117 = uVar119,
                              pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar247 = fVar247 * 1.5 +
                                  fVar247 * fVar247 * (float)local_458._0_4_ * -0.5 * fVar247;
                        fVar299 = fVar299 * fVar247;
                        fVar269 = fVar269 * fVar247;
                        fVar301 = fVar301 * fVar247;
                        fVar247 = fStack_54c * fVar299 + local_558;
                        fVar249 = fStack_54c * fVar269 + fStack_554;
                        fVar266 = fStack_54c * fVar301 + fStack_550;
                        fVar272 = fVar269 * local_558 - fStack_554 * fVar299;
                        fVar268 = fVar301 * fStack_554 - fStack_550 * fVar269;
                        fVar299 = fVar299 * fStack_550 - local_558 * fVar301;
                        local_368 = fVar268 * fVar249 - fVar299 * fVar247;
                        local_388._4_4_ = fVar299 * fVar266 - fVar272 * fVar249;
                        local_378 = fVar272 * fVar247 - fVar268 * fVar266;
                        local_388._0_4_ = local_388._4_4_;
                        fStack_380 = (float)local_388._4_4_;
                        fStack_37c = (float)local_388._4_4_;
                        fStack_374 = local_378;
                        fStack_370 = local_378;
                        fStack_36c = local_378;
                        fStack_364 = local_368;
                        fStack_360 = local_368;
                        fStack_35c = local_368;
                        local_358 = fVar457;
                        fStack_354 = fVar457;
                        fStack_350 = fVar457;
                        fStack_34c = fVar457;
                        local_348 = 0;
                        uStack_344 = 0;
                        uStack_340 = 0;
                        uStack_33c = 0;
                        local_338 = CONCAT44(uVar127,uVar127);
                        uStack_330 = CONCAT44(uVar127,uVar127);
                        local_328 = CONCAT44(uVar125,uVar125);
                        uStack_320 = CONCAT44(uVar125,uVar125);
                        local_318 = context->user->instID[0];
                        uStack_314 = local_318;
                        uStack_310 = local_318;
                        uStack_30c = local_318;
                        local_308 = context->user->instPrimID[0];
                        uStack_304 = local_308;
                        uStack_300 = local_308;
                        uStack_2fc = local_308;
                        *(float *)(ray + k * 4 + 0x80) = fVar217;
                        local_5a8 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        args.valid = (int *)local_5a8;
                        args.geometryUserPtr = pGVar26->userPtr;
                        args.context = context->user;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)local_388;
                        args.N = 4;
                        p_Var30 = pGVar26->occlusionFilterN;
                        auVar464._8_8_ = &local_318;
                        auVar464._0_8_ = p_Var30;
                        pRVar115 = (RTCIntersectArguments *)context;
                        local_548 = fVar441;
                        uStack_544 = fVar444;
                        if (p_Var30 != (RTCFilterFunctionN)0x0) {
                          auVar464 = (*p_Var30)(&args);
                        }
                        uVar117 = auVar464._8_8_;
                        auVar206._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                        auVar206._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                        auVar206._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                        auVar206._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                        uVar124 = movmskps(auVar464._0_4_,auVar206);
                        pRVar113 = (RTCRayN *)(ulong)(uVar124 ^ 0xf);
                        if ((uVar124 ^ 0xf) == 0) {
                          auVar206 = auVar206 ^ _DAT_01f46b70;
                          fVar441 = local_548;
                          fVar444 = uStack_544;
                        }
                        else {
                          pRVar115 = context->args;
                          if ((RTCIntersectArguments *)pRVar115->filter ==
                              (RTCIntersectArguments *)0x0) {
                          }
                          else if ((((ulong)*(Scene **)&pRVar115->flags & 2) != 0) ||
                                  (((pGVar26->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)pRVar115->filter)(&args);
                            uVar117 = extraout_RDX_02;
                          }
                          auVar181._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                          auVar181._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                          auVar181._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                          auVar181._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                          auVar206 = auVar181 ^ _DAT_01f46b70;
                          *(undefined1 (*) [16])(args.ray + 0x80) =
                               ~auVar181 & _DAT_01f45a40 |
                               *(undefined1 (*) [16])(args.ray + 0x80) & auVar181;
                          pRVar113 = args.ray;
                          fVar441 = local_548;
                          fVar444 = uStack_544;
                        }
                        auVar207._0_4_ = auVar206._0_4_ << 0x1f;
                        auVar207._4_4_ = auVar206._4_4_ << 0x1f;
                        auVar207._8_4_ = auVar206._8_4_ << 0x1f;
                        auVar207._12_4_ = auVar206._12_4_ << 0x1f;
                        iVar132 = movmskps((int)pRVar113,auVar207);
                        lVar114 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar113 >> 0x20),iVar132)
                                                 >> 8),iVar132 != 0);
                        if (iVar132 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar246;
                        }
                      }
                    }
                  }
                }
                goto LAB_0035fd61;
              }
            }
            bVar122 = false;
LAB_0035fd61:
            bVar121 = bVar121 | bVar122 & (byte)lVar114;
            fVar426 = *(float *)(ray + k * 4 + 0x80);
            auVar179._0_4_ = -(uint)(fVar445 <= fVar426) & local_3a8._0_4_;
            auVar179._4_4_ = -(uint)(fVar447 <= fVar426) & local_3a8._4_4_;
            auVar179._8_4_ = -(uint)(fVar449 <= fVar426) & local_3a8._8_4_;
            auVar179._12_4_ = -(uint)(fVar455 <= fVar426) & local_3a8._12_4_;
            auVar291 = auVar350;
          }
          auVar325._0_4_ =
               local_598._0_4_ & auVar291._0_4_ & -(uint)(local_588 + fVar442 <= fVar426);
          auVar325._4_4_ =
               local_598._4_4_ & auVar291._4_4_ & -(uint)(fStack_584 + fVar456 <= fVar426);
          auVar325._8_4_ =
               (uint)fStack_590 & auVar291._8_4_ & -(uint)(fStack_580 + fVar244 <= fVar426);
          auVar325._12_4_ =
               (uint)fStack_58c & auVar291._12_4_ & -(uint)(fStack_57c + fVar448 <= fVar426);
          auVar296._0_4_ =
               auVar178._0_4_ & auVar238._0_4_ &
               -(uint)(local_588 + tp1.lower.field_0.v[0] <= fVar426);
          auVar296._4_4_ =
               auVar178._4_4_ & auVar238._4_4_ &
               -(uint)(fStack_584 + tp1.lower.field_0.v[1] <= fVar426);
          auVar296._8_4_ =
               auVar178._8_4_ & auVar238._8_4_ &
               -(uint)(fStack_580 + tp1.lower.field_0.v[2] <= fVar426);
          auVar296._12_4_ =
               auVar178._12_4_ & auVar238._12_4_ &
               -(uint)(fStack_57c + tp1.lower.field_0.v[3] <= fVar426);
          iVar132 = movmskps(0,auVar296 | auVar325);
          pRVar116 = pRVar115;
          fVar340 = local_588;
          fVar344 = fStack_584;
          fVar353 = fStack_580;
          fVar357 = fStack_57c;
          if (iVar132 != 0) {
            stack[uVar129].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar296 | auVar325);
            stack[uVar129].tlower.field_0.i[0] =
                 ~auVar325._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar442 & auVar325._0_4_;
            stack[uVar129].tlower.field_0.i[1] =
                 ~auVar325._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar456 & auVar325._4_4_;
            stack[uVar129].tlower.field_0.i[2] =
                 ~auVar325._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar244 & auVar325._8_4_;
            stack[uVar129].tlower.field_0.i[3] =
                 ~auVar325._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar448 & auVar325._12_4_;
            stack[uVar129].u0 = fVar267;
            stack[uVar129].u1 = fVar270;
            stack[uVar129].depth = uVar118 + 1;
            uVar129 = uVar129 + 1;
          }
        }
      }
    }
    do {
      uVar124 = uVar129;
      if (uVar124 == 0) {
        if (bVar121 != 0) goto LAB_0036036c;
        fVar243 = *(float *)(ray + k * 4 + 0x80);
        auVar211._4_4_ = -(uint)(fVar212 <= fVar243);
        auVar211._0_4_ = -(uint)(fVar188 <= fVar243);
        auVar211._8_4_ = -(uint)(fVar213 <= fVar243);
        auVar211._12_4_ = -(uint)(fVar216 <= fVar243);
        uVar125 = movmskps((int)pRVar116,auVar211);
        uVar123 = uVar123 - 1 & uVar123 & uVar125;
        goto LAB_0035db06;
      }
      uVar129 = uVar124 - 1;
      pRVar116 = (RTCIntersectArguments *)(ulong)uVar129;
      fVar270 = stack[(long)pRVar116].tlower.field_0.v[0];
      fVar442 = stack[(long)pRVar116].tlower.field_0.v[1];
      fVar445 = stack[(long)pRVar116].tlower.field_0.v[2];
      fVar447 = stack[(long)pRVar116].tlower.field_0.v[3];
      fVar267 = *(float *)(ray + k * 4 + 0x80);
      aVar182._0_4_ =
           -(uint)(fVar340 + fVar270 <= fVar267) & stack[(long)pRVar116].valid.field_0.i[0];
      aVar182._4_4_ =
           -(uint)(fVar344 + fVar442 <= fVar267) & stack[(long)pRVar116].valid.field_0.i[1];
      aVar182.i[2] = -(uint)(fVar353 + fVar445 <= fVar267) &
                     stack[(long)pRVar116].valid.field_0.i[2];
      aVar182.i[3] = -(uint)(fVar357 + fVar447 <= fVar267) &
                     stack[(long)pRVar116].valid.field_0.i[3];
      _local_388 = aVar182;
      uVar126 = movmskps((int)uVar117,(undefined1  [16])aVar182);
      uVar117 = (ulong)uVar126;
    } while (uVar126 == 0);
    auVar208._0_4_ = (uint)fVar270 & aVar182._0_4_;
    auVar208._4_4_ = (uint)fVar442 & aVar182._4_4_;
    auVar208._8_4_ = (uint)fVar445 & aVar182.i[2];
    auVar208._12_4_ = (uint)fVar447 & aVar182.i[3];
    auVar241._0_8_ = CONCAT44(~aVar182._4_4_,~aVar182._0_4_) & 0x7f8000007f800000;
    auVar241._8_4_ = ~aVar182.i[2] & 0x7f800000;
    auVar241._12_4_ = ~aVar182.i[3] & 0x7f800000;
    auVar241 = auVar241 | auVar208;
    auVar261._4_4_ = auVar241._0_4_;
    auVar261._0_4_ = auVar241._4_4_;
    auVar261._8_4_ = auVar241._12_4_;
    auVar261._12_4_ = auVar241._8_4_;
    auVar308 = minps(auVar261,auVar241);
    auVar209._0_8_ = auVar308._8_8_;
    auVar209._8_4_ = auVar308._0_4_;
    auVar209._12_4_ = auVar308._4_4_;
    auVar308 = minps(auVar209,auVar308);
    auVar210._0_8_ =
         CONCAT44(-(uint)(auVar308._4_4_ == auVar241._4_4_) & aVar182._4_4_,
                  -(uint)(auVar308._0_4_ == auVar241._0_4_) & aVar182._0_4_);
    auVar210._8_4_ = -(uint)(auVar308._8_4_ == auVar241._8_4_) & aVar182.i[2];
    auVar210._12_4_ = -(uint)(auVar308._12_4_ == auVar241._12_4_) & aVar182.i[3];
    iVar132 = movmskps(uVar129,auVar210);
    if (iVar132 != 0) {
      aVar182.i[2] = auVar210._8_4_;
      aVar182._0_8_ = auVar210._0_8_;
      aVar182.i[3] = auVar210._12_4_;
    }
    pSVar112 = stack + (long)pRVar116;
    uVar129 = movmskps(iVar132,(undefined1  [16])aVar182);
    pRVar115 = (RTCIntersectArguments *)0x0;
    if (uVar129 != 0) {
      for (; (uVar129 >> (long)pRVar115 & 1) == 0;
          pRVar115 = (RTCIntersectArguments *)((long)&pRVar115->flags + 1)) {
      }
    }
    *(undefined4 *)(local_388 + (long)pRVar115 * 4) = 0;
    uVar9 = stack[(long)pRVar116].u0;
    uVar17 = stack[(long)pRVar116].u1;
    uVar118 = stack[(long)pRVar116].depth;
    iVar132 = movmskps(uVar126,(undefined1  [16])_local_388);
    uVar129 = uVar124 - 1;
    if (iVar132 != 0) {
      uVar129 = uVar124;
    }
    uVar117 = (ulong)uVar129;
    (pSVar112->valid).field_0 = _local_388;
    fVar267 = (float)uVar17 - (float)uVar9;
    args.valid = (int *)CONCAT44(fVar267 * 0.33333334 + (float)uVar9,fVar267 * 0.0 + (float)uVar9);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar267 * 1.0 + (float)uVar9,fVar267 * 0.6666667 + (float)uVar9);
    fVar267 = *(float *)((long)&args.valid + (long)pRVar115 * 4);
    fVar270 = *(float *)((long)&args.valid + (long)pRVar115 * 4 + 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }